

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O0

void ncnn::convdw3x3s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [32];
  float fVar87;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _sum0_2;
  __m256 _r24_1;
  __m256 _r14_1;
  __m256 _r04_1;
  __m256 _r23_1;
  __m256 _r13_1;
  __m256 _r03_1;
  __m256 _sum1_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum0_1;
  __m256 _r28;
  __m256 _r18;
  __m256 _r08;
  __m256 _r27;
  __m256 _r17;
  __m256 _r07;
  __m256 _sum3;
  __m256 _r26;
  __m256 _r16;
  __m256 _r06;
  __m256 _r25;
  __m256 _r15;
  __m256 _r05;
  __m256 _sum2;
  __m256 _r24;
  __m256 _r14;
  __m256 _r04;
  __m256 _r23;
  __m256 _r13;
  __m256 _r03;
  __m256 _sum1;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float in_stack_ffffffffffffab0c;
  float in_stack_ffffffffffffab10;
  float in_stack_ffffffffffffab14;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  int local_3dc8;
  int local_3dc4;
  float *local_3ca0;
  float *local_3c98;
  float *local_3c90;
  Mat local_3c88;
  float *local_3c40;
  float *local_3c38;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  Mat local_3be8;
  int local_3b9c;
  float *local_3b98;
  int local_3b8c;
  int local_3b88;
  int local_3b84;
  int local_3b80;
  int local_3b7c;
  Mat *local_3b68;
  undefined4 local_3b4c;
  float *local_3b48;
  float *local_3b40;
  float *local_3b38;
  float *local_3b30;
  float *local_3b28;
  float *local_3b20;
  float *local_3b18;
  float *local_3b10;
  float *local_3b08;
  float *local_3b00;
  float *local_3af8;
  float *local_3af0;
  float *local_3ae8;
  float *local_3ae0;
  float *local_3ad8;
  float *local_3ad0;
  float *local_3ac8;
  float *local_3ac0;
  float *local_3ab8;
  float *local_3ab0;
  float *local_3aa8;
  float *local_3aa0;
  float *local_3a98;
  float *local_3a90;
  float *local_3a88;
  float *local_3a80;
  float *local_3a78;
  float *local_3a70;
  float *local_3a68;
  float *local_3a60;
  float *local_3a58;
  float *local_3a50;
  float *local_3a48;
  float *local_3a40;
  float *local_3a38;
  float *local_3a30;
  float *local_3a28;
  float *local_3a20;
  float *local_3a18;
  float *local_3a10;
  float *local_3a08;
  float *local_3a00;
  float *local_39f8;
  float *local_39f0;
  float *local_39e8;
  float *local_39e0;
  float *local_39d8;
  float *local_39d0;
  float *local_39c8;
  float *local_39c0;
  float *local_39b8;
  float *local_39b0;
  float *local_39a8;
  float *local_39a0;
  float *local_3998;
  float *local_3990;
  float *local_3988;
  float *local_3980;
  float *local_3978;
  float *local_3970;
  float *local_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float *local_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float *local_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  float *local_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  float *local_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float *local_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float *local_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float *local_2008;
  undefined1 local_2000 [32];
  undefined4 local_1fe0;
  undefined4 local_1fdc;
  undefined4 local_1fd8;
  undefined4 local_1fd4;
  undefined4 local_1fd0;
  undefined4 local_1fcc;
  undefined4 local_1fc8;
  undefined4 local_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float fStack_19c8;
  float fStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_3b7c = *(int *)(in_RDI + 0x2c);
  local_3b80 = *(int *)(in_RSI + 0x2c);
  local_3b84 = *(int *)(in_RSI + 0x30);
  local_3b88 = *(int *)(in_RDI + 0x38);
  local_3b8c = (local_3b7c * 2 + local_3b80 * -2) * 8;
  local_3b68 = in_RDX;
  local_3b98 = Mat::operator_cast_to_float_(in_RCX);
  for (local_3b9c = 0; local_3b9c < local_3b88; local_3b9c = local_3b9c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10),
                 (int)in_stack_ffffffffffffab0c);
    if (local_3b98 == (float *)0x0) {
      local_3b4c = 0;
      local_1fc4 = 0;
      local_1fc8 = 0;
      local_1fcc = 0;
      local_1fd0 = 0;
      local_1fd4 = 0;
      local_1fd8 = 0;
      local_1fdc = 0;
      local_1fe0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar80._16_16_ = auVar1;
      auVar80._0_16_ = auVar2;
      local_2000._0_8_ = auVar2._0_8_;
      local_2000._8_8_ = auVar2._8_8_;
      local_2000._16_8_ = auVar1._0_8_;
      local_2000._24_8_ = auVar1._8_8_;
      local_4560 = local_2000._0_8_;
      uStack_4558 = local_2000._8_8_;
      uStack_4550 = local_2000._16_8_;
      uStack_4548 = local_2000._24_8_;
      local_2000 = auVar80;
    }
    else {
      local_3968 = local_3b98 + (local_3b9c << 3);
      local_4560 = *(undefined8 *)local_3968;
      uStack_4558 = *(undefined8 *)(local_3968 + 2);
      uStack_4550 = *(undefined8 *)(local_3968 + 4);
      uStack_4548 = *(undefined8 *)(local_3968 + 6);
    }
    local_3c20 = local_4560;
    uStack_3c18 = uStack_4558;
    uStack_3c10 = uStack_4550;
    uStack_3c08 = uStack_4548;
    local_3c38 = Mat::row(local_3b68,local_3b9c);
    local_3c40 = Mat::row(&local_3be8,0);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10),
                 (int)in_stack_ffffffffffffab0c);
    local_3c90 = Mat::row(&local_3c88,0);
    local_3c98 = Mat::row(&local_3c88,1);
    local_3ca0 = Mat::row(&local_3c88,2);
    local_3970 = local_3c38;
    uVar3 = *(undefined8 *)local_3c38;
    uVar4 = *(undefined8 *)(local_3c38 + 2);
    uVar5 = *(undefined8 *)(local_3c38 + 4);
    uVar6 = *(undefined8 *)(local_3c38 + 6);
    local_3978 = local_3c38 + 8;
    uVar7 = *(undefined8 *)local_3978;
    uVar8 = *(undefined8 *)(local_3c38 + 10);
    uVar9 = *(undefined8 *)(local_3c38 + 0xc);
    uVar10 = *(undefined8 *)(local_3c38 + 0xe);
    local_3980 = local_3c38 + 0x10;
    uVar11 = *(undefined8 *)local_3980;
    uVar12 = *(undefined8 *)(local_3c38 + 0x12);
    uVar13 = *(undefined8 *)(local_3c38 + 0x14);
    uVar14 = *(undefined8 *)(local_3c38 + 0x16);
    local_3988 = local_3c38 + 0x18;
    uVar15 = *(undefined8 *)local_3988;
    uVar16 = *(undefined8 *)(local_3c38 + 0x1a);
    uVar17 = *(undefined8 *)(local_3c38 + 0x1c);
    uVar18 = *(undefined8 *)(local_3c38 + 0x1e);
    local_3990 = local_3c38 + 0x20;
    uVar19 = *(undefined8 *)local_3990;
    uVar20 = *(undefined8 *)(local_3c38 + 0x22);
    uVar21 = *(undefined8 *)(local_3c38 + 0x24);
    uVar22 = *(undefined8 *)(local_3c38 + 0x26);
    local_3998 = local_3c38 + 0x28;
    uVar23 = *(undefined8 *)local_3998;
    uVar24 = *(undefined8 *)(local_3c38 + 0x2a);
    uVar25 = *(undefined8 *)(local_3c38 + 0x2c);
    uVar26 = *(undefined8 *)(local_3c38 + 0x2e);
    local_39a0 = local_3c38 + 0x30;
    uVar27 = *(undefined8 *)local_39a0;
    uVar28 = *(undefined8 *)(local_3c38 + 0x32);
    uVar29 = *(undefined8 *)(local_3c38 + 0x34);
    uVar30 = *(undefined8 *)(local_3c38 + 0x36);
    local_39a8 = local_3c38 + 0x38;
    uVar31 = *(undefined8 *)local_39a8;
    uVar32 = *(undefined8 *)(local_3c38 + 0x3a);
    uVar33 = *(undefined8 *)(local_3c38 + 0x3c);
    uVar34 = *(undefined8 *)(local_3c38 + 0x3e);
    local_39b0 = local_3c38 + 0x40;
    uVar35 = *(undefined8 *)local_39b0;
    uVar36 = *(undefined8 *)(local_3c38 + 0x42);
    uVar37 = *(undefined8 *)(local_3c38 + 0x44);
    uVar38 = *(undefined8 *)(local_3c38 + 0x46);
    for (local_3dc4 = 0; local_3dc4 < local_3b84; local_3dc4 = local_3dc4 + 1) {
      local_3dc8 = 0;
      while( true ) {
        uVar78 = uStack_1fa8;
        uVar77 = uStack_1fb0;
        uVar76 = uStack_1fb8;
        uVar75 = local_1fc0;
        uVar74 = uStack_21c8;
        uVar73 = uStack_21d0;
        uVar72 = uStack_21d8;
        uVar71 = local_21e0;
        uVar70 = uStack_2228;
        uVar69 = uStack_2230;
        uVar68 = uStack_2238;
        uVar67 = local_2240;
        uVar66 = uStack_2288;
        uVar65 = uStack_2290;
        uVar64 = uStack_2298;
        uVar63 = local_22a0;
        uVar62 = uStack_22e8;
        uVar61 = uStack_22f0;
        uVar60 = uStack_22f8;
        uVar59 = local_2300;
        uVar58 = uStack_2348;
        uVar57 = uStack_2350;
        uVar56 = uStack_2358;
        uVar55 = local_2360;
        uVar54 = uStack_23a8;
        uVar53 = uStack_23b0;
        uVar52 = uStack_23b8;
        uVar51 = local_23c0;
        uVar50 = uStack_2408;
        uVar49 = uStack_2410;
        uVar48 = uStack_2418;
        uVar47 = local_2420;
        uVar46 = uStack_2468;
        uVar45 = uStack_2470;
        uVar44 = uStack_2478;
        uVar43 = local_2480;
        uVar42 = uStack_24c8;
        uVar41 = uStack_24d0;
        uVar40 = uStack_24d8;
        uVar39 = local_24e0;
        local_21e0._0_4_ = (float)uVar3;
        local_21e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_21d8._0_4_ = (float)uVar4;
        uStack_21d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_21d0._0_4_ = (float)uVar5;
        uStack_21d0._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_21c8._0_4_ = (float)uVar6;
        uStack_21c8._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_1fc0._0_4_ = (float)local_3c20;
        local_1fc0._4_4_ = (float)((ulong)local_3c20 >> 0x20);
        uStack_1fb8._0_4_ = (float)uStack_3c18;
        uStack_1fb8._4_4_ = (float)((ulong)uStack_3c18 >> 0x20);
        uStack_1fb0._0_4_ = (float)uStack_3c10;
        uStack_1fb0._4_4_ = (float)((ulong)uStack_3c10 >> 0x20);
        uStack_1fa8._0_4_ = (float)uStack_3c08;
        uStack_1fa8._4_4_ = (float)((ulong)uStack_3c08 >> 0x20);
        local_2240._0_4_ = (float)uVar7;
        local_2240._4_4_ = (float)((ulong)uVar7 >> 0x20);
        uStack_2238._0_4_ = (float)uVar8;
        uStack_2238._4_4_ = (float)((ulong)uVar8 >> 0x20);
        uStack_2230._0_4_ = (float)uVar9;
        uStack_2230._4_4_ = (float)((ulong)uVar9 >> 0x20);
        uStack_2228._0_4_ = (float)uVar10;
        uStack_2228._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_22a0._0_4_ = (float)uVar11;
        local_22a0._4_4_ = (float)((ulong)uVar11 >> 0x20);
        uStack_2298._0_4_ = (float)uVar12;
        uStack_2298._4_4_ = (float)((ulong)uVar12 >> 0x20);
        uStack_2290._0_4_ = (float)uVar13;
        uStack_2290._4_4_ = (float)((ulong)uVar13 >> 0x20);
        uStack_2288._0_4_ = (float)uVar14;
        uStack_2288._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_2300._0_4_ = (float)uVar15;
        local_2300._4_4_ = (float)((ulong)uVar15 >> 0x20);
        uStack_22f8._0_4_ = (float)uVar16;
        uStack_22f8._4_4_ = (float)((ulong)uVar16 >> 0x20);
        uStack_22f0._0_4_ = (float)uVar17;
        uStack_22f0._4_4_ = (float)((ulong)uVar17 >> 0x20);
        uStack_22e8._0_4_ = (float)uVar18;
        uStack_22e8._4_4_ = (float)((ulong)uVar18 >> 0x20);
        local_2360._0_4_ = (float)uVar19;
        local_2360._4_4_ = (float)((ulong)uVar19 >> 0x20);
        uStack_2358._0_4_ = (float)uVar20;
        uStack_2358._4_4_ = (float)((ulong)uVar20 >> 0x20);
        uStack_2350._0_4_ = (float)uVar21;
        uStack_2350._4_4_ = (float)((ulong)uVar21 >> 0x20);
        uStack_2348._0_4_ = (float)uVar22;
        uStack_2348._4_4_ = (float)((ulong)uVar22 >> 0x20);
        local_23c0._0_4_ = (float)uVar23;
        local_23c0._4_4_ = (float)((ulong)uVar23 >> 0x20);
        uStack_23b8._0_4_ = (float)uVar24;
        uStack_23b8._4_4_ = (float)((ulong)uVar24 >> 0x20);
        uStack_23b0._0_4_ = (float)uVar25;
        uStack_23b0._4_4_ = (float)((ulong)uVar25 >> 0x20);
        uStack_23a8._0_4_ = (float)uVar26;
        uStack_23a8._4_4_ = (float)((ulong)uVar26 >> 0x20);
        local_2420._0_4_ = (float)uVar27;
        local_2420._4_4_ = (float)((ulong)uVar27 >> 0x20);
        uStack_2418._0_4_ = (float)uVar28;
        uStack_2418._4_4_ = (float)((ulong)uVar28 >> 0x20);
        uStack_2410._0_4_ = (float)uVar29;
        uStack_2410._4_4_ = (float)((ulong)uVar29 >> 0x20);
        uStack_2408._0_4_ = (float)uVar30;
        uStack_2408._4_4_ = (float)((ulong)uVar30 >> 0x20);
        local_2480._0_4_ = (float)uVar31;
        local_2480._4_4_ = (float)((ulong)uVar31 >> 0x20);
        uStack_2478._0_4_ = (float)uVar32;
        uStack_2478._4_4_ = (float)((ulong)uVar32 >> 0x20);
        uStack_2470._0_4_ = (float)uVar33;
        uStack_2470._4_4_ = (float)((ulong)uVar33 >> 0x20);
        uStack_2468._0_4_ = (float)uVar34;
        uStack_2468._4_4_ = (float)((ulong)uVar34 >> 0x20);
        local_24e0._0_4_ = (float)uVar35;
        local_24e0._4_4_ = (float)((ulong)uVar35 >> 0x20);
        uStack_24d8._0_4_ = (float)uVar36;
        uStack_24d8._4_4_ = (float)((ulong)uVar36 >> 0x20);
        uStack_24d0._0_4_ = (float)uVar37;
        uStack_24d0._4_4_ = (float)((ulong)uVar37 >> 0x20);
        uStack_24c8._0_4_ = (float)uVar38;
        uStack_24c8._4_4_ = (float)((ulong)uVar38 >> 0x20);
        if (local_3b80 <= local_3dc8 + 3) break;
        local_39b8 = local_3c90;
        local_2200 = *(undefined8 *)local_3c90;
        uStack_21f8 = *(undefined8 *)(local_3c90 + 2);
        uStack_21f0 = *(undefined8 *)(local_3c90 + 4);
        uStack_21e8 = *(undefined8 *)(local_3c90 + 6);
        local_39c0 = local_3c90 + 8;
        local_2260 = *(undefined8 *)local_39c0;
        uStack_2258 = *(undefined8 *)(local_3c90 + 10);
        uStack_2250 = *(undefined8 *)(local_3c90 + 0xc);
        uStack_2248 = *(undefined8 *)(local_3c90 + 0xe);
        local_39c8 = local_3c90 + 0x10;
        local_2560 = *(undefined8 *)local_39c8;
        uStack_2558 = *(undefined8 *)(local_3c90 + 0x12);
        uStack_2550 = *(undefined8 *)(local_3c90 + 0x14);
        uStack_2548 = *(undefined8 *)(local_3c90 + 0x16);
        local_39d0 = local_3c98;
        local_2320 = *(undefined8 *)local_3c98;
        uStack_2318 = *(undefined8 *)(local_3c98 + 2);
        uStack_2310 = *(undefined8 *)(local_3c98 + 4);
        uStack_2308 = *(undefined8 *)(local_3c98 + 6);
        local_39d8 = local_3c98 + 8;
        local_2380 = *(undefined8 *)local_39d8;
        uStack_2378 = *(undefined8 *)(local_3c98 + 10);
        uStack_2370 = *(undefined8 *)(local_3c98 + 0xc);
        uStack_2368 = *(undefined8 *)(local_3c98 + 0xe);
        local_39e0 = local_3c98 + 0x10;
        local_2680 = *(undefined8 *)local_39e0;
        uStack_2678 = *(undefined8 *)(local_3c98 + 0x12);
        uStack_2670 = *(undefined8 *)(local_3c98 + 0x14);
        uStack_2668 = *(undefined8 *)(local_3c98 + 0x16);
        local_39e8 = local_3ca0;
        local_2440 = *(undefined8 *)local_3ca0;
        uStack_2438 = *(undefined8 *)(local_3ca0 + 2);
        uStack_2430 = *(undefined8 *)(local_3ca0 + 4);
        uStack_2428 = *(undefined8 *)(local_3ca0 + 6);
        local_39f0 = local_3ca0 + 8;
        local_24a0 = *(undefined8 *)local_39f0;
        uStack_2498 = *(undefined8 *)(local_3ca0 + 10);
        uStack_2490 = *(undefined8 *)(local_3ca0 + 0xc);
        uStack_2488 = *(undefined8 *)(local_3ca0 + 0xe);
        local_39f8 = local_3ca0 + 0x10;
        local_27a0 = *(undefined8 *)local_39f8;
        uStack_2798 = *(undefined8 *)(local_3ca0 + 0x12);
        uStack_2790 = *(undefined8 *)(local_3ca0 + 0x14);
        uStack_2788 = *(undefined8 *)(local_3ca0 + 0x16);
        local_2220 = local_3c20;
        uStack_2218 = uStack_3c18;
        uStack_2210 = uStack_3c10;
        uStack_2208 = uStack_3c08;
        local_fe0 = (float)local_21e0;
        fStack_fdc = local_21e0._4_4_;
        fStack_fd8 = (float)uStack_21d8;
        fStack_fd4 = uStack_21d8._4_4_;
        fStack_fd0 = (float)uStack_21d0;
        fStack_fcc = uStack_21d0._4_4_;
        fStack_fc8 = (float)uStack_21c8;
        fStack_1f84 = uStack_21c8._4_4_;
        local_1000._0_4_ = (float)local_2200;
        local_1000._4_4_ = (float)((ulong)local_2200 >> 0x20);
        uStack_ff8._0_4_ = (float)uStack_21f8;
        uStack_ff8._4_4_ = (float)((ulong)uStack_21f8 >> 0x20);
        uStack_ff0._0_4_ = (float)uStack_21f0;
        uStack_ff0._4_4_ = (float)((ulong)uStack_21f0 >> 0x20);
        uStack_fe8._0_4_ = (float)uStack_21e8;
        local_1fa0 = (float)local_21e0 * (float)local_1000;
        fStack_1f9c = local_21e0._4_4_ * local_1000._4_4_;
        fStack_1f98 = (float)uStack_21d8 * (float)uStack_ff8;
        fStack_1f94 = uStack_21d8._4_4_ * uStack_ff8._4_4_;
        fStack_1f90 = (float)uStack_21d0 * (float)uStack_ff0;
        fStack_1f8c = uStack_21d0._4_4_ * uStack_ff0._4_4_;
        fStack_1f88 = (float)uStack_21c8 * (float)uStack_fe8;
        local_2280 = CONCAT44(fStack_1f9c + local_1fc0._4_4_,local_1fa0 + (float)local_1fc0);
        uStack_2278 = CONCAT44(fStack_1f94 + uStack_1fb8._4_4_,fStack_1f98 + (float)uStack_1fb8);
        uStack_2270 = CONCAT44(fStack_1f8c + uStack_1fb0._4_4_,fStack_1f90 + (float)uStack_1fb0);
        uStack_2268 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1f88 + (float)uStack_1fa8);
        local_fa0 = (float)local_2240;
        fStack_f9c = local_2240._4_4_;
        fStack_f98 = (float)uStack_2238;
        fStack_f94 = uStack_2238._4_4_;
        fStack_f90 = (float)uStack_2230;
        fStack_f8c = uStack_2230._4_4_;
        fStack_f88 = (float)uStack_2228;
        fStack_1f44 = uStack_2228._4_4_;
        local_fc0._0_4_ = (float)local_2260;
        local_fc0._4_4_ = (float)((ulong)local_2260 >> 0x20);
        uStack_fb8._0_4_ = (float)uStack_2258;
        uStack_fb8._4_4_ = (float)((ulong)uStack_2258 >> 0x20);
        uStack_fb0._0_4_ = (float)uStack_2250;
        uStack_fb0._4_4_ = (float)((ulong)uStack_2250 >> 0x20);
        uStack_fa8._0_4_ = (float)uStack_2248;
        local_1f60 = (float)local_2240 * (float)local_fc0;
        fStack_1f5c = local_2240._4_4_ * local_fc0._4_4_;
        fStack_1f58 = (float)uStack_2238 * (float)uStack_fb8;
        fStack_1f54 = uStack_2238._4_4_ * uStack_fb8._4_4_;
        fStack_1f50 = (float)uStack_2230 * (float)uStack_fb0;
        fStack_1f4c = uStack_2230._4_4_ * uStack_fb0._4_4_;
        fStack_1f48 = (float)uStack_2228 * (float)uStack_fa8;
        fVar79 = local_1f60 + local_1fa0 + (float)local_1fc0;
        fVar81 = fStack_1f5c + fStack_1f9c + local_1fc0._4_4_;
        fVar82 = fStack_1f58 + fStack_1f98 + (float)uStack_1fb8;
        fVar83 = fStack_1f54 + fStack_1f94 + uStack_1fb8._4_4_;
        fVar84 = fStack_1f50 + fStack_1f90 + (float)uStack_1fb0;
        fVar85 = fStack_1f4c + fStack_1f8c + uStack_1fb0._4_4_;
        fVar86 = fStack_1f48 + fStack_1f88 + (float)uStack_1fa8;
        fVar87 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_22e0 = CONCAT44(fVar81,fVar79);
        uStack_22d8 = CONCAT44(fVar83,fVar82);
        uStack_22d0 = CONCAT44(fVar85,fVar84);
        uStack_22c8 = CONCAT44(fVar87,fVar86);
        local_f60 = (float)local_22a0;
        fStack_f5c = local_22a0._4_4_;
        fStack_f58 = (float)uStack_2298;
        fStack_f54 = uStack_2298._4_4_;
        fStack_f50 = (float)uStack_2290;
        fStack_f4c = uStack_2290._4_4_;
        fStack_f48 = (float)uStack_2288;
        fStack_1f04 = uStack_2288._4_4_;
        local_f80._0_4_ = (float)local_2560;
        local_f80._4_4_ = (float)((ulong)local_2560 >> 0x20);
        uStack_f78._0_4_ = (float)uStack_2558;
        uStack_f78._4_4_ = (float)((ulong)uStack_2558 >> 0x20);
        uStack_f70._0_4_ = (float)uStack_2550;
        uStack_f70._4_4_ = (float)((ulong)uStack_2550 >> 0x20);
        uStack_f68._0_4_ = (float)uStack_2548;
        local_1f20 = (float)local_22a0 * (float)local_f80;
        fStack_1f1c = local_22a0._4_4_ * local_f80._4_4_;
        fStack_1f18 = (float)uStack_2298 * (float)uStack_f78;
        fStack_1f14 = uStack_2298._4_4_ * uStack_f78._4_4_;
        fStack_1f10 = (float)uStack_2290 * (float)uStack_f70;
        fStack_1f0c = uStack_2290._4_4_ * uStack_f70._4_4_;
        fStack_1f08 = (float)uStack_2288 * (float)uStack_f68;
        fVar79 = local_1f20 + fVar79;
        fVar81 = fStack_1f1c + fVar81;
        fVar82 = fStack_1f18 + fVar82;
        fVar83 = fStack_1f14 + fVar83;
        fVar84 = fStack_1f10 + fVar84;
        fVar85 = fStack_1f0c + fVar85;
        fVar86 = fStack_1f08 + fVar86;
        fVar87 = uStack_2288._4_4_ + fVar87;
        local_2340 = CONCAT44(fVar81,fVar79);
        uStack_2338 = CONCAT44(fVar83,fVar82);
        uStack_2330 = CONCAT44(fVar85,fVar84);
        uStack_2328 = CONCAT44(fVar87,fVar86);
        local_f20 = (float)local_2300;
        fStack_f1c = local_2300._4_4_;
        fStack_f18 = (float)uStack_22f8;
        fStack_f14 = uStack_22f8._4_4_;
        fStack_f10 = (float)uStack_22f0;
        fStack_f0c = uStack_22f0._4_4_;
        fStack_f08 = (float)uStack_22e8;
        fStack_1ec4 = uStack_22e8._4_4_;
        local_f40._0_4_ = (float)local_2320;
        local_f40._4_4_ = (float)((ulong)local_2320 >> 0x20);
        uStack_f38._0_4_ = (float)uStack_2318;
        uStack_f38._4_4_ = (float)((ulong)uStack_2318 >> 0x20);
        uStack_f30._0_4_ = (float)uStack_2310;
        uStack_f30._4_4_ = (float)((ulong)uStack_2310 >> 0x20);
        uStack_f28._0_4_ = (float)uStack_2308;
        local_1ee0 = (float)local_2300 * (float)local_f40;
        fStack_1edc = local_2300._4_4_ * local_f40._4_4_;
        fStack_1ed8 = (float)uStack_22f8 * (float)uStack_f38;
        fStack_1ed4 = uStack_22f8._4_4_ * uStack_f38._4_4_;
        fStack_1ed0 = (float)uStack_22f0 * (float)uStack_f30;
        fStack_1ecc = uStack_22f0._4_4_ * uStack_f30._4_4_;
        fStack_1ec8 = (float)uStack_22e8 * (float)uStack_f28;
        fVar79 = local_1ee0 + fVar79;
        fVar81 = fStack_1edc + fVar81;
        fVar82 = fStack_1ed8 + fVar82;
        fVar83 = fStack_1ed4 + fVar83;
        fVar84 = fStack_1ed0 + fVar84;
        fVar85 = fStack_1ecc + fVar85;
        fVar86 = fStack_1ec8 + fVar86;
        fVar87 = uStack_22e8._4_4_ + fVar87;
        local_23a0 = CONCAT44(fVar81,fVar79);
        uStack_2398 = CONCAT44(fVar83,fVar82);
        uStack_2390 = CONCAT44(fVar85,fVar84);
        uStack_2388 = CONCAT44(fVar87,fVar86);
        local_ee0 = (float)local_2360;
        fStack_edc = local_2360._4_4_;
        fStack_ed8 = (float)uStack_2358;
        fStack_ed4 = uStack_2358._4_4_;
        fStack_ed0 = (float)uStack_2350;
        fStack_ecc = uStack_2350._4_4_;
        fStack_ec8 = (float)uStack_2348;
        fStack_1e84 = uStack_2348._4_4_;
        local_f00._0_4_ = (float)local_2380;
        local_f00._4_4_ = (float)((ulong)local_2380 >> 0x20);
        uStack_ef8._0_4_ = (float)uStack_2378;
        uStack_ef8._4_4_ = (float)((ulong)uStack_2378 >> 0x20);
        uStack_ef0._0_4_ = (float)uStack_2370;
        uStack_ef0._4_4_ = (float)((ulong)uStack_2370 >> 0x20);
        uStack_ee8._0_4_ = (float)uStack_2368;
        local_1ea0 = (float)local_2360 * (float)local_f00;
        fStack_1e9c = local_2360._4_4_ * local_f00._4_4_;
        fStack_1e98 = (float)uStack_2358 * (float)uStack_ef8;
        fStack_1e94 = uStack_2358._4_4_ * uStack_ef8._4_4_;
        fStack_1e90 = (float)uStack_2350 * (float)uStack_ef0;
        fStack_1e8c = uStack_2350._4_4_ * uStack_ef0._4_4_;
        fStack_1e88 = (float)uStack_2348 * (float)uStack_ee8;
        fVar79 = local_1ea0 + fVar79;
        fVar81 = fStack_1e9c + fVar81;
        fVar82 = fStack_1e98 + fVar82;
        fVar83 = fStack_1e94 + fVar83;
        fVar84 = fStack_1e90 + fVar84;
        fVar85 = fStack_1e8c + fVar85;
        fVar86 = fStack_1e88 + fVar86;
        fVar87 = uStack_2348._4_4_ + fVar87;
        local_2400 = CONCAT44(fVar81,fVar79);
        uStack_23f8 = CONCAT44(fVar83,fVar82);
        uStack_23f0 = CONCAT44(fVar85,fVar84);
        uStack_23e8 = CONCAT44(fVar87,fVar86);
        local_ea0 = (float)local_23c0;
        fStack_e9c = local_23c0._4_4_;
        fStack_e98 = (float)uStack_23b8;
        fStack_e94 = uStack_23b8._4_4_;
        fStack_e90 = (float)uStack_23b0;
        fStack_e8c = uStack_23b0._4_4_;
        fStack_e88 = (float)uStack_23a8;
        fStack_1e44 = uStack_23a8._4_4_;
        local_ec0._0_4_ = (float)local_2680;
        local_ec0._4_4_ = (float)((ulong)local_2680 >> 0x20);
        uStack_eb8._0_4_ = (float)uStack_2678;
        uStack_eb8._4_4_ = (float)((ulong)uStack_2678 >> 0x20);
        uStack_eb0._0_4_ = (float)uStack_2670;
        uStack_eb0._4_4_ = (float)((ulong)uStack_2670 >> 0x20);
        uStack_ea8._0_4_ = (float)uStack_2668;
        local_1e60 = (float)local_23c0 * (float)local_ec0;
        fStack_1e5c = local_23c0._4_4_ * local_ec0._4_4_;
        fStack_1e58 = (float)uStack_23b8 * (float)uStack_eb8;
        fStack_1e54 = uStack_23b8._4_4_ * uStack_eb8._4_4_;
        fStack_1e50 = (float)uStack_23b0 * (float)uStack_eb0;
        fStack_1e4c = uStack_23b0._4_4_ * uStack_eb0._4_4_;
        fStack_1e48 = (float)uStack_23a8 * (float)uStack_ea8;
        fVar79 = local_1e60 + fVar79;
        fVar81 = fStack_1e5c + fVar81;
        fVar82 = fStack_1e58 + fVar82;
        fVar83 = fStack_1e54 + fVar83;
        fVar84 = fStack_1e50 + fVar84;
        fVar85 = fStack_1e4c + fVar85;
        fVar86 = fStack_1e48 + fVar86;
        fVar87 = uStack_23a8._4_4_ + fVar87;
        local_2460 = CONCAT44(fVar81,fVar79);
        uStack_2458 = CONCAT44(fVar83,fVar82);
        uStack_2450 = CONCAT44(fVar85,fVar84);
        uStack_2448 = CONCAT44(fVar87,fVar86);
        local_e60 = (float)local_2420;
        fStack_e5c = local_2420._4_4_;
        fStack_e58 = (float)uStack_2418;
        fStack_e54 = uStack_2418._4_4_;
        fStack_e50 = (float)uStack_2410;
        fStack_e4c = uStack_2410._4_4_;
        fStack_e48 = (float)uStack_2408;
        fStack_1e04 = uStack_2408._4_4_;
        local_e80._0_4_ = (float)local_2440;
        local_e80._4_4_ = (float)((ulong)local_2440 >> 0x20);
        uStack_e78._0_4_ = (float)uStack_2438;
        uStack_e78._4_4_ = (float)((ulong)uStack_2438 >> 0x20);
        uStack_e70._0_4_ = (float)uStack_2430;
        uStack_e70._4_4_ = (float)((ulong)uStack_2430 >> 0x20);
        uStack_e68._0_4_ = (float)uStack_2428;
        local_1e20 = (float)local_2420 * (float)local_e80;
        fStack_1e1c = local_2420._4_4_ * local_e80._4_4_;
        fStack_1e18 = (float)uStack_2418 * (float)uStack_e78;
        fStack_1e14 = uStack_2418._4_4_ * uStack_e78._4_4_;
        fStack_1e10 = (float)uStack_2410 * (float)uStack_e70;
        fStack_1e0c = uStack_2410._4_4_ * uStack_e70._4_4_;
        fStack_1e08 = (float)uStack_2408 * (float)uStack_e68;
        fVar79 = local_1e20 + fVar79;
        fVar81 = fStack_1e1c + fVar81;
        fVar82 = fStack_1e18 + fVar82;
        fVar83 = fStack_1e14 + fVar83;
        fVar84 = fStack_1e10 + fVar84;
        fVar85 = fStack_1e0c + fVar85;
        fVar86 = fStack_1e08 + fVar86;
        fVar87 = uStack_2408._4_4_ + fVar87;
        local_24c0 = CONCAT44(fVar81,fVar79);
        uStack_24b8 = CONCAT44(fVar83,fVar82);
        uStack_24b0 = CONCAT44(fVar85,fVar84);
        uStack_24a8 = CONCAT44(fVar87,fVar86);
        local_e20 = (float)local_2480;
        fStack_e1c = local_2480._4_4_;
        fStack_e18 = (float)uStack_2478;
        fStack_e14 = uStack_2478._4_4_;
        fStack_e10 = (float)uStack_2470;
        fStack_e0c = uStack_2470._4_4_;
        fStack_e08 = (float)uStack_2468;
        fStack_1dc4 = uStack_2468._4_4_;
        local_e40._0_4_ = (float)local_24a0;
        local_e40._4_4_ = (float)((ulong)local_24a0 >> 0x20);
        uStack_e38._0_4_ = (float)uStack_2498;
        uStack_e38._4_4_ = (float)((ulong)uStack_2498 >> 0x20);
        uStack_e30._0_4_ = (float)uStack_2490;
        uStack_e30._4_4_ = (float)((ulong)uStack_2490 >> 0x20);
        uStack_e28._0_4_ = (float)uStack_2488;
        local_1de0 = (float)local_2480 * (float)local_e40;
        fStack_1ddc = local_2480._4_4_ * local_e40._4_4_;
        fStack_1dd8 = (float)uStack_2478 * (float)uStack_e38;
        fStack_1dd4 = uStack_2478._4_4_ * uStack_e38._4_4_;
        fStack_1dd0 = (float)uStack_2470 * (float)uStack_e30;
        fStack_1dcc = uStack_2470._4_4_ * uStack_e30._4_4_;
        fStack_1dc8 = (float)uStack_2468 * (float)uStack_e28;
        fVar79 = local_1de0 + fVar79;
        fVar81 = fStack_1ddc + fVar81;
        fVar82 = fStack_1dd8 + fVar82;
        fVar83 = fStack_1dd4 + fVar83;
        fVar84 = fStack_1dd0 + fVar84;
        fVar85 = fStack_1dcc + fVar85;
        fVar86 = fStack_1dc8 + fVar86;
        fVar87 = uStack_2468._4_4_ + fVar87;
        local_2520 = CONCAT44(fVar81,fVar79);
        uStack_2518 = CONCAT44(fVar83,fVar82);
        uStack_2510 = CONCAT44(fVar85,fVar84);
        uStack_2508 = CONCAT44(fVar87,fVar86);
        local_de0 = (float)local_24e0;
        fStack_ddc = local_24e0._4_4_;
        fStack_dd8 = (float)uStack_24d8;
        fStack_dd4 = uStack_24d8._4_4_;
        fStack_dd0 = (float)uStack_24d0;
        fStack_dcc = uStack_24d0._4_4_;
        fStack_dc8 = (float)uStack_24c8;
        fStack_1d84 = uStack_24c8._4_4_;
        local_e00._0_4_ = (float)local_27a0;
        local_e00._4_4_ = (float)((ulong)local_27a0 >> 0x20);
        uStack_df8._0_4_ = (float)uStack_2798;
        uStack_df8._4_4_ = (float)((ulong)uStack_2798 >> 0x20);
        uStack_df0._0_4_ = (float)uStack_2790;
        uStack_df0._4_4_ = (float)((ulong)uStack_2790 >> 0x20);
        uStack_de8._0_4_ = (float)uStack_2788;
        local_1da0 = (float)local_24e0 * (float)local_e00;
        fStack_1d9c = local_24e0._4_4_ * local_e00._4_4_;
        fStack_1d98 = (float)uStack_24d8 * (float)uStack_df8;
        fStack_1d94 = uStack_24d8._4_4_ * uStack_df8._4_4_;
        fStack_1d90 = (float)uStack_24d0 * (float)uStack_df0;
        fStack_1d8c = uStack_24d0._4_4_ * uStack_df0._4_4_;
        fStack_1d88 = (float)uStack_24c8 * (float)uStack_de8;
        local_2040 = CONCAT44(fStack_1d9c + fVar81,local_1da0 + fVar79);
        uStack_2038 = CONCAT44(fStack_1d94 + fVar83,fStack_1d98 + fVar82);
        uStack_2030 = CONCAT44(fStack_1d8c + fVar85,fStack_1d90 + fVar84);
        uStack_2028 = CONCAT44(uStack_24c8._4_4_ + fVar87,fStack_1d88 + fVar86);
        local_3a00 = local_3c90 + 0x18;
        local_25c0 = *(undefined8 *)local_3a00;
        uStack_25b8 = *(undefined8 *)(local_3c90 + 0x1a);
        uStack_25b0 = *(undefined8 *)(local_3c90 + 0x1c);
        uStack_25a8 = *(undefined8 *)(local_3c90 + 0x1e);
        local_3a08 = local_3c98 + 0x18;
        local_26e0 = *(undefined8 *)local_3a08;
        uStack_26d8 = *(undefined8 *)(local_3c98 + 0x1a);
        uStack_26d0 = *(undefined8 *)(local_3c98 + 0x1c);
        uStack_26c8 = *(undefined8 *)(local_3c98 + 0x1e);
        local_3a10 = local_3ca0 + 0x18;
        local_2800 = *(undefined8 *)local_3a10;
        uStack_27f8 = *(undefined8 *)(local_3ca0 + 0x1a);
        uStack_27f0 = *(undefined8 *)(local_3ca0 + 0x1c);
        uStack_27e8 = *(undefined8 *)(local_3ca0 + 0x1e);
        local_3a18 = local_3c90 + 0x20;
        local_28c0 = *(undefined8 *)local_3a18;
        uStack_28b8 = *(undefined8 *)(local_3c90 + 0x22);
        uStack_28b0 = *(undefined8 *)(local_3c90 + 0x24);
        uStack_28a8 = *(undefined8 *)(local_3c90 + 0x26);
        local_3a20 = local_3c98 + 0x20;
        local_29e0 = *(undefined8 *)local_3a20;
        uStack_29d8 = *(undefined8 *)(local_3c98 + 0x22);
        uStack_29d0 = *(undefined8 *)(local_3c98 + 0x24);
        uStack_29c8 = *(undefined8 *)(local_3c98 + 0x26);
        local_3a28 = local_3ca0 + 0x20;
        local_2b00 = *(undefined8 *)local_3a28;
        uStack_2af8 = *(undefined8 *)(local_3ca0 + 0x22);
        uStack_2af0 = *(undefined8 *)(local_3ca0 + 0x24);
        uStack_2ae8 = *(undefined8 *)(local_3ca0 + 0x26);
        local_2008 = local_3c40;
        *(undefined8 *)local_3c40 = local_2040;
        *(undefined8 *)(local_3c40 + 2) = uStack_2038;
        *(undefined8 *)(local_3c40 + 4) = uStack_2030;
        *(undefined8 *)(local_3c40 + 6) = uStack_2028;
        local_2580 = local_3c20;
        uStack_2578 = uStack_3c18;
        uStack_2570 = uStack_3c10;
        uStack_2568 = uStack_3c08;
        local_da0 = (float)local_21e0;
        fStack_d9c = local_21e0._4_4_;
        fStack_d98 = (float)uStack_21d8;
        fStack_d94 = uStack_21d8._4_4_;
        fStack_d90 = (float)uStack_21d0;
        fStack_d8c = uStack_21d0._4_4_;
        fStack_d88 = (float)uStack_21c8;
        fStack_1d44 = uStack_21c8._4_4_;
        local_1d60 = (float)local_21e0 * (float)local_f80;
        fStack_1d5c = local_21e0._4_4_ * local_f80._4_4_;
        fStack_1d58 = (float)uStack_21d8 * (float)uStack_f78;
        fStack_1d54 = uStack_21d8._4_4_ * uStack_f78._4_4_;
        fStack_1d50 = (float)uStack_21d0 * (float)uStack_f70;
        fStack_1d4c = uStack_21d0._4_4_ * uStack_f70._4_4_;
        fStack_1d48 = (float)uStack_21c8 * (float)uStack_f68;
        local_1d80 = local_3c20;
        uStack_1d78 = uStack_3c18;
        uStack_1d70 = uStack_3c10;
        uStack_1d68 = uStack_3c08;
        local_25e0 = CONCAT44(fStack_1d5c + local_1fc0._4_4_,local_1d60 + (float)local_1fc0);
        uStack_25d8 = CONCAT44(fStack_1d54 + uStack_1fb8._4_4_,fStack_1d58 + (float)uStack_1fb8);
        uStack_25d0 = CONCAT44(fStack_1d4c + uStack_1fb0._4_4_,fStack_1d50 + (float)uStack_1fb0);
        uStack_25c8 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1d48 + (float)uStack_1fa8);
        local_d60 = (float)local_2240;
        fStack_d5c = local_2240._4_4_;
        fStack_d58 = (float)uStack_2238;
        fStack_d54 = uStack_2238._4_4_;
        fStack_d50 = (float)uStack_2230;
        fStack_d4c = uStack_2230._4_4_;
        fStack_d48 = (float)uStack_2228;
        fStack_1d04 = uStack_2228._4_4_;
        local_d80._0_4_ = (float)local_25c0;
        local_d80._4_4_ = (float)((ulong)local_25c0 >> 0x20);
        uStack_d78._0_4_ = (float)uStack_25b8;
        uStack_d78._4_4_ = (float)((ulong)uStack_25b8 >> 0x20);
        uStack_d70._0_4_ = (float)uStack_25b0;
        uStack_d70._4_4_ = (float)((ulong)uStack_25b0 >> 0x20);
        uStack_d68._0_4_ = (float)uStack_25a8;
        local_1d20 = (float)local_2240 * (float)local_d80;
        fStack_1d1c = local_2240._4_4_ * local_d80._4_4_;
        fStack_1d18 = (float)uStack_2238 * (float)uStack_d78;
        fStack_1d14 = uStack_2238._4_4_ * uStack_d78._4_4_;
        fStack_1d10 = (float)uStack_2230 * (float)uStack_d70;
        fStack_1d0c = uStack_2230._4_4_ * uStack_d70._4_4_;
        fStack_1d08 = (float)uStack_2228 * (float)uStack_d68;
        fVar79 = local_1d20 + local_1d60 + (float)local_1fc0;
        fVar81 = fStack_1d1c + fStack_1d5c + local_1fc0._4_4_;
        fVar82 = fStack_1d18 + fStack_1d58 + (float)uStack_1fb8;
        fVar83 = fStack_1d14 + fStack_1d54 + uStack_1fb8._4_4_;
        fVar84 = fStack_1d10 + fStack_1d50 + (float)uStack_1fb0;
        fVar85 = fStack_1d0c + fStack_1d4c + uStack_1fb0._4_4_;
        fVar86 = fStack_1d08 + fStack_1d48 + (float)uStack_1fa8;
        fVar87 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_2640 = CONCAT44(fVar81,fVar79);
        uStack_2638 = CONCAT44(fVar83,fVar82);
        uStack_2630 = CONCAT44(fVar85,fVar84);
        uStack_2628 = CONCAT44(fVar87,fVar86);
        local_d20 = (float)local_22a0;
        fStack_d1c = local_22a0._4_4_;
        fStack_d18 = (float)uStack_2298;
        fStack_d14 = uStack_2298._4_4_;
        fStack_d10 = (float)uStack_2290;
        fStack_d0c = uStack_2290._4_4_;
        fStack_d08 = (float)uStack_2288;
        fStack_1cc4 = uStack_2288._4_4_;
        local_d40._0_4_ = (float)local_28c0;
        local_d40._4_4_ = (float)((ulong)local_28c0 >> 0x20);
        uStack_d38._0_4_ = (float)uStack_28b8;
        uStack_d38._4_4_ = (float)((ulong)uStack_28b8 >> 0x20);
        uStack_d30._0_4_ = (float)uStack_28b0;
        uStack_d30._4_4_ = (float)((ulong)uStack_28b0 >> 0x20);
        uStack_d28._0_4_ = (float)uStack_28a8;
        local_1ce0 = (float)local_22a0 * (float)local_d40;
        fStack_1cdc = local_22a0._4_4_ * local_d40._4_4_;
        fStack_1cd8 = (float)uStack_2298 * (float)uStack_d38;
        fStack_1cd4 = uStack_2298._4_4_ * uStack_d38._4_4_;
        fStack_1cd0 = (float)uStack_2290 * (float)uStack_d30;
        fStack_1ccc = uStack_2290._4_4_ * uStack_d30._4_4_;
        fStack_1cc8 = (float)uStack_2288 * (float)uStack_d28;
        fVar79 = local_1ce0 + fVar79;
        fVar81 = fStack_1cdc + fVar81;
        fVar82 = fStack_1cd8 + fVar82;
        fVar83 = fStack_1cd4 + fVar83;
        fVar84 = fStack_1cd0 + fVar84;
        fVar85 = fStack_1ccc + fVar85;
        fVar86 = fStack_1cc8 + fVar86;
        fVar87 = uStack_2288._4_4_ + fVar87;
        local_26a0 = CONCAT44(fVar81,fVar79);
        uStack_2698 = CONCAT44(fVar83,fVar82);
        uStack_2690 = CONCAT44(fVar85,fVar84);
        uStack_2688 = CONCAT44(fVar87,fVar86);
        local_ce0 = (float)local_2300;
        fStack_cdc = local_2300._4_4_;
        fStack_cd8 = (float)uStack_22f8;
        fStack_cd4 = uStack_22f8._4_4_;
        fStack_cd0 = (float)uStack_22f0;
        fStack_ccc = uStack_22f0._4_4_;
        fStack_cc8 = (float)uStack_22e8;
        fStack_1c84 = uStack_22e8._4_4_;
        local_1ca0 = (float)local_2300 * (float)local_ec0;
        fStack_1c9c = local_2300._4_4_ * local_ec0._4_4_;
        fStack_1c98 = (float)uStack_22f8 * (float)uStack_eb8;
        fStack_1c94 = uStack_22f8._4_4_ * uStack_eb8._4_4_;
        fStack_1c90 = (float)uStack_22f0 * (float)uStack_eb0;
        fStack_1c8c = uStack_22f0._4_4_ * uStack_eb0._4_4_;
        fStack_1c88 = (float)uStack_22e8 * (float)uStack_ea8;
        fVar79 = local_1ca0 + fVar79;
        fVar81 = fStack_1c9c + fVar81;
        fVar82 = fStack_1c98 + fVar82;
        fVar83 = fStack_1c94 + fVar83;
        fVar84 = fStack_1c90 + fVar84;
        fVar85 = fStack_1c8c + fVar85;
        fVar86 = fStack_1c88 + fVar86;
        fVar87 = uStack_22e8._4_4_ + fVar87;
        local_2700 = CONCAT44(fVar81,fVar79);
        uStack_26f8 = CONCAT44(fVar83,fVar82);
        uStack_26f0 = CONCAT44(fVar85,fVar84);
        uStack_26e8 = CONCAT44(fVar87,fVar86);
        local_ca0 = (float)local_2360;
        fStack_c9c = local_2360._4_4_;
        fStack_c98 = (float)uStack_2358;
        fStack_c94 = uStack_2358._4_4_;
        fStack_c90 = (float)uStack_2350;
        fStack_c8c = uStack_2350._4_4_;
        fStack_c88 = (float)uStack_2348;
        fStack_1c44 = uStack_2348._4_4_;
        local_cc0._0_4_ = (float)local_26e0;
        local_cc0._4_4_ = (float)((ulong)local_26e0 >> 0x20);
        uStack_cb8._0_4_ = (float)uStack_26d8;
        uStack_cb8._4_4_ = (float)((ulong)uStack_26d8 >> 0x20);
        uStack_cb0._0_4_ = (float)uStack_26d0;
        uStack_cb0._4_4_ = (float)((ulong)uStack_26d0 >> 0x20);
        uStack_ca8._0_4_ = (float)uStack_26c8;
        local_1c60 = (float)local_2360 * (float)local_cc0;
        fStack_1c5c = local_2360._4_4_ * local_cc0._4_4_;
        fStack_1c58 = (float)uStack_2358 * (float)uStack_cb8;
        fStack_1c54 = uStack_2358._4_4_ * uStack_cb8._4_4_;
        fStack_1c50 = (float)uStack_2350 * (float)uStack_cb0;
        fStack_1c4c = uStack_2350._4_4_ * uStack_cb0._4_4_;
        fStack_1c48 = (float)uStack_2348 * (float)uStack_ca8;
        fVar79 = local_1c60 + fVar79;
        fVar81 = fStack_1c5c + fVar81;
        fVar82 = fStack_1c58 + fVar82;
        fVar83 = fStack_1c54 + fVar83;
        fVar84 = fStack_1c50 + fVar84;
        fVar85 = fStack_1c4c + fVar85;
        fVar86 = fStack_1c48 + fVar86;
        fVar87 = uStack_2348._4_4_ + fVar87;
        local_2760 = CONCAT44(fVar81,fVar79);
        uStack_2758 = CONCAT44(fVar83,fVar82);
        uStack_2750 = CONCAT44(fVar85,fVar84);
        uStack_2748 = CONCAT44(fVar87,fVar86);
        local_c60 = (float)local_23c0;
        fStack_c5c = local_23c0._4_4_;
        fStack_c58 = (float)uStack_23b8;
        fStack_c54 = uStack_23b8._4_4_;
        fStack_c50 = (float)uStack_23b0;
        fStack_c4c = uStack_23b0._4_4_;
        fStack_c48 = (float)uStack_23a8;
        fStack_1c04 = uStack_23a8._4_4_;
        local_c80._0_4_ = (float)local_29e0;
        local_c80._4_4_ = (float)((ulong)local_29e0 >> 0x20);
        uStack_c78._0_4_ = (float)uStack_29d8;
        uStack_c78._4_4_ = (float)((ulong)uStack_29d8 >> 0x20);
        uStack_c70._0_4_ = (float)uStack_29d0;
        uStack_c70._4_4_ = (float)((ulong)uStack_29d0 >> 0x20);
        uStack_c68._0_4_ = (float)uStack_29c8;
        local_1c20 = (float)local_23c0 * (float)local_c80;
        fStack_1c1c = local_23c0._4_4_ * local_c80._4_4_;
        fStack_1c18 = (float)uStack_23b8 * (float)uStack_c78;
        fStack_1c14 = uStack_23b8._4_4_ * uStack_c78._4_4_;
        fStack_1c10 = (float)uStack_23b0 * (float)uStack_c70;
        fStack_1c0c = uStack_23b0._4_4_ * uStack_c70._4_4_;
        fStack_1c08 = (float)uStack_23a8 * (float)uStack_c68;
        fVar79 = local_1c20 + fVar79;
        fVar81 = fStack_1c1c + fVar81;
        fVar82 = fStack_1c18 + fVar82;
        fVar83 = fStack_1c14 + fVar83;
        fVar84 = fStack_1c10 + fVar84;
        fVar85 = fStack_1c0c + fVar85;
        fVar86 = fStack_1c08 + fVar86;
        fVar87 = uStack_23a8._4_4_ + fVar87;
        local_27c0 = CONCAT44(fVar81,fVar79);
        uStack_27b8 = CONCAT44(fVar83,fVar82);
        uStack_27b0 = CONCAT44(fVar85,fVar84);
        uStack_27a8 = CONCAT44(fVar87,fVar86);
        local_c20 = (float)local_2420;
        fStack_c1c = local_2420._4_4_;
        fStack_c18 = (float)uStack_2418;
        fStack_c14 = uStack_2418._4_4_;
        fStack_c10 = (float)uStack_2410;
        fStack_c0c = uStack_2410._4_4_;
        fStack_c08 = (float)uStack_2408;
        fStack_1bc4 = uStack_2408._4_4_;
        local_1be0 = (float)local_2420 * (float)local_e00;
        fStack_1bdc = local_2420._4_4_ * local_e00._4_4_;
        fStack_1bd8 = (float)uStack_2418 * (float)uStack_df8;
        fStack_1bd4 = uStack_2418._4_4_ * uStack_df8._4_4_;
        fStack_1bd0 = (float)uStack_2410 * (float)uStack_df0;
        fStack_1bcc = uStack_2410._4_4_ * uStack_df0._4_4_;
        fStack_1bc8 = (float)uStack_2408 * (float)uStack_de8;
        fVar79 = local_1be0 + fVar79;
        fVar81 = fStack_1bdc + fVar81;
        fVar82 = fStack_1bd8 + fVar82;
        fVar83 = fStack_1bd4 + fVar83;
        fVar84 = fStack_1bd0 + fVar84;
        fVar85 = fStack_1bcc + fVar85;
        fVar86 = fStack_1bc8 + fVar86;
        fVar87 = uStack_2408._4_4_ + fVar87;
        local_2820 = CONCAT44(fVar81,fVar79);
        uStack_2818 = CONCAT44(fVar83,fVar82);
        uStack_2810 = CONCAT44(fVar85,fVar84);
        uStack_2808 = CONCAT44(fVar87,fVar86);
        local_be0 = (float)local_2480;
        fStack_bdc = local_2480._4_4_;
        fStack_bd8 = (float)uStack_2478;
        fStack_bd4 = uStack_2478._4_4_;
        fStack_bd0 = (float)uStack_2470;
        fStack_bcc = uStack_2470._4_4_;
        fStack_bc8 = (float)uStack_2468;
        fStack_1b84 = uStack_2468._4_4_;
        local_c00._0_4_ = (float)local_2800;
        local_c00._4_4_ = (float)((ulong)local_2800 >> 0x20);
        uStack_bf8._0_4_ = (float)uStack_27f8;
        uStack_bf8._4_4_ = (float)((ulong)uStack_27f8 >> 0x20);
        uStack_bf0._0_4_ = (float)uStack_27f0;
        uStack_bf0._4_4_ = (float)((ulong)uStack_27f0 >> 0x20);
        uStack_be8._0_4_ = (float)uStack_27e8;
        local_1ba0 = (float)local_2480 * (float)local_c00;
        fStack_1b9c = local_2480._4_4_ * local_c00._4_4_;
        fStack_1b98 = (float)uStack_2478 * (float)uStack_bf8;
        fStack_1b94 = uStack_2478._4_4_ * uStack_bf8._4_4_;
        fStack_1b90 = (float)uStack_2470 * (float)uStack_bf0;
        fStack_1b8c = uStack_2470._4_4_ * uStack_bf0._4_4_;
        fStack_1b88 = (float)uStack_2468 * (float)uStack_be8;
        fVar79 = local_1ba0 + fVar79;
        fVar81 = fStack_1b9c + fVar81;
        fVar82 = fStack_1b98 + fVar82;
        fVar83 = fStack_1b94 + fVar83;
        fVar84 = fStack_1b90 + fVar84;
        fVar85 = fStack_1b8c + fVar85;
        fVar86 = fStack_1b88 + fVar86;
        fVar87 = uStack_2468._4_4_ + fVar87;
        local_2880 = CONCAT44(fVar81,fVar79);
        uStack_2878 = CONCAT44(fVar83,fVar82);
        uStack_2870 = CONCAT44(fVar85,fVar84);
        uStack_2868 = CONCAT44(fVar87,fVar86);
        local_ba0 = (float)local_24e0;
        fStack_b9c = local_24e0._4_4_;
        fStack_b98 = (float)uStack_24d8;
        fStack_b94 = uStack_24d8._4_4_;
        fStack_b90 = (float)uStack_24d0;
        fStack_b8c = uStack_24d0._4_4_;
        fStack_b88 = (float)uStack_24c8;
        fStack_1b44 = uStack_24c8._4_4_;
        local_bc0._0_4_ = (float)local_2b00;
        local_bc0._4_4_ = (float)((ulong)local_2b00 >> 0x20);
        uStack_bb8._0_4_ = (float)uStack_2af8;
        uStack_bb8._4_4_ = (float)((ulong)uStack_2af8 >> 0x20);
        uStack_bb0._0_4_ = (float)uStack_2af0;
        uStack_bb0._4_4_ = (float)((ulong)uStack_2af0 >> 0x20);
        uStack_ba8._0_4_ = (float)uStack_2ae8;
        local_1b60 = (float)local_24e0 * (float)local_bc0;
        fStack_1b5c = local_24e0._4_4_ * local_bc0._4_4_;
        fStack_1b58 = (float)uStack_24d8 * (float)uStack_bb8;
        fStack_1b54 = uStack_24d8._4_4_ * uStack_bb8._4_4_;
        fStack_1b50 = (float)uStack_24d0 * (float)uStack_bb0;
        fStack_1b4c = uStack_24d0._4_4_ * uStack_bb0._4_4_;
        fStack_1b48 = (float)uStack_24c8 * (float)uStack_ba8;
        local_2080 = CONCAT44(fStack_1b5c + fVar81,local_1b60 + fVar79);
        uStack_2078 = CONCAT44(fStack_1b54 + fVar83,fStack_1b58 + fVar82);
        uStack_2070 = CONCAT44(fStack_1b4c + fVar85,fStack_1b50 + fVar84);
        uStack_2068 = CONCAT44(uStack_24c8._4_4_ + fVar87,fStack_1b48 + fVar86);
        local_3a30 = local_3c90 + 0x28;
        local_2920 = *(undefined8 *)local_3a30;
        uStack_2918 = *(undefined8 *)(local_3c90 + 0x2a);
        uStack_2910 = *(undefined8 *)(local_3c90 + 0x2c);
        uStack_2908 = *(undefined8 *)(local_3c90 + 0x2e);
        local_3a38 = local_3c98 + 0x28;
        local_2a40 = *(undefined8 *)local_3a38;
        uStack_2a38 = *(undefined8 *)(local_3c98 + 0x2a);
        uStack_2a30 = *(undefined8 *)(local_3c98 + 0x2c);
        uStack_2a28 = *(undefined8 *)(local_3c98 + 0x2e);
        local_3a40 = local_3ca0 + 0x28;
        local_2b60 = *(undefined8 *)local_3a40;
        uStack_2b58 = *(undefined8 *)(local_3ca0 + 0x2a);
        uStack_2b50 = *(undefined8 *)(local_3ca0 + 0x2c);
        uStack_2b48 = *(undefined8 *)(local_3ca0 + 0x2e);
        local_3a48 = local_3c90 + 0x30;
        local_2c20 = *(undefined8 *)local_3a48;
        uStack_2c18 = *(undefined8 *)(local_3c90 + 0x32);
        uStack_2c10 = *(undefined8 *)(local_3c90 + 0x34);
        uStack_2c08 = *(undefined8 *)(local_3c90 + 0x36);
        local_3a50 = local_3c98 + 0x30;
        local_2d40 = *(undefined8 *)local_3a50;
        uStack_2d38 = *(undefined8 *)(local_3c98 + 0x32);
        uStack_2d30 = *(undefined8 *)(local_3c98 + 0x34);
        uStack_2d28 = *(undefined8 *)(local_3c98 + 0x36);
        local_3a58 = local_3ca0 + 0x30;
        local_2e60 = *(undefined8 *)local_3a58;
        uStack_2e58 = *(undefined8 *)(local_3ca0 + 0x32);
        uStack_2e50 = *(undefined8 *)(local_3ca0 + 0x34);
        uStack_2e48 = *(undefined8 *)(local_3ca0 + 0x36);
        local_2048 = local_3c40 + 8;
        *(undefined8 *)local_2048 = local_2080;
        *(undefined8 *)(local_3c40 + 10) = uStack_2078;
        *(undefined8 *)(local_3c40 + 0xc) = uStack_2070;
        *(undefined8 *)(local_3c40 + 0xe) = uStack_2068;
        local_28e0 = local_3c20;
        uStack_28d8 = uStack_3c18;
        uStack_28d0 = uStack_3c10;
        uStack_28c8 = uStack_3c08;
        local_b60 = (float)local_21e0;
        fStack_b5c = local_21e0._4_4_;
        fStack_b58 = (float)uStack_21d8;
        fStack_b54 = uStack_21d8._4_4_;
        fStack_b50 = (float)uStack_21d0;
        fStack_b4c = uStack_21d0._4_4_;
        fStack_b48 = (float)uStack_21c8;
        fStack_1b04 = uStack_21c8._4_4_;
        local_1b20 = (float)local_21e0 * (float)local_d40;
        fStack_1b1c = local_21e0._4_4_ * local_d40._4_4_;
        fStack_1b18 = (float)uStack_21d8 * (float)uStack_d38;
        fStack_1b14 = uStack_21d8._4_4_ * uStack_d38._4_4_;
        fStack_1b10 = (float)uStack_21d0 * (float)uStack_d30;
        fStack_1b0c = uStack_21d0._4_4_ * uStack_d30._4_4_;
        fStack_1b08 = (float)uStack_21c8 * (float)uStack_d28;
        local_1b40 = local_3c20;
        uStack_1b38 = uStack_3c18;
        uStack_1b30 = uStack_3c10;
        uStack_1b28 = uStack_3c08;
        local_2940 = CONCAT44(fStack_1b1c + local_1fc0._4_4_,local_1b20 + (float)local_1fc0);
        uStack_2938 = CONCAT44(fStack_1b14 + uStack_1fb8._4_4_,fStack_1b18 + (float)uStack_1fb8);
        uStack_2930 = CONCAT44(fStack_1b0c + uStack_1fb0._4_4_,fStack_1b10 + (float)uStack_1fb0);
        uStack_2928 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1b08 + (float)uStack_1fa8);
        local_b20 = (float)local_2240;
        fStack_b1c = local_2240._4_4_;
        fStack_b18 = (float)uStack_2238;
        fStack_b14 = uStack_2238._4_4_;
        fStack_b10 = (float)uStack_2230;
        fStack_b0c = uStack_2230._4_4_;
        fStack_b08 = (float)uStack_2228;
        fStack_1ac4 = uStack_2228._4_4_;
        local_b40._0_4_ = (float)local_2920;
        local_b40._4_4_ = (float)((ulong)local_2920 >> 0x20);
        uStack_b38._0_4_ = (float)uStack_2918;
        uStack_b38._4_4_ = (float)((ulong)uStack_2918 >> 0x20);
        uStack_b30._0_4_ = (float)uStack_2910;
        uStack_b30._4_4_ = (float)((ulong)uStack_2910 >> 0x20);
        uStack_b28._0_4_ = (float)uStack_2908;
        local_1ae0 = (float)local_2240 * (float)local_b40;
        fStack_1adc = local_2240._4_4_ * local_b40._4_4_;
        fStack_1ad8 = (float)uStack_2238 * (float)uStack_b38;
        fStack_1ad4 = uStack_2238._4_4_ * uStack_b38._4_4_;
        fStack_1ad0 = (float)uStack_2230 * (float)uStack_b30;
        fStack_1acc = uStack_2230._4_4_ * uStack_b30._4_4_;
        fStack_1ac8 = (float)uStack_2228 * (float)uStack_b28;
        fVar79 = local_1ae0 + local_1b20 + (float)local_1fc0;
        fVar81 = fStack_1adc + fStack_1b1c + local_1fc0._4_4_;
        fVar82 = fStack_1ad8 + fStack_1b18 + (float)uStack_1fb8;
        fVar83 = fStack_1ad4 + fStack_1b14 + uStack_1fb8._4_4_;
        fVar84 = fStack_1ad0 + fStack_1b10 + (float)uStack_1fb0;
        fVar85 = fStack_1acc + fStack_1b0c + uStack_1fb0._4_4_;
        fVar86 = fStack_1ac8 + fStack_1b08 + (float)uStack_1fa8;
        fVar87 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_29a0 = CONCAT44(fVar81,fVar79);
        uStack_2998 = CONCAT44(fVar83,fVar82);
        uStack_2990 = CONCAT44(fVar85,fVar84);
        uStack_2988 = CONCAT44(fVar87,fVar86);
        local_ae0 = (float)local_22a0;
        fStack_adc = local_22a0._4_4_;
        fStack_ad8 = (float)uStack_2298;
        fStack_ad4 = uStack_2298._4_4_;
        fStack_ad0 = (float)uStack_2290;
        fStack_acc = uStack_2290._4_4_;
        fStack_ac8 = (float)uStack_2288;
        fStack_1a84 = uStack_2288._4_4_;
        local_b00._0_4_ = (float)local_2c20;
        local_b00._4_4_ = (float)((ulong)local_2c20 >> 0x20);
        uStack_af8._0_4_ = (float)uStack_2c18;
        uStack_af8._4_4_ = (float)((ulong)uStack_2c18 >> 0x20);
        uStack_af0._0_4_ = (float)uStack_2c10;
        uStack_af0._4_4_ = (float)((ulong)uStack_2c10 >> 0x20);
        uStack_ae8._0_4_ = (float)uStack_2c08;
        local_1aa0 = (float)local_22a0 * (float)local_b00;
        fStack_1a9c = local_22a0._4_4_ * local_b00._4_4_;
        fStack_1a98 = (float)uStack_2298 * (float)uStack_af8;
        fStack_1a94 = uStack_2298._4_4_ * uStack_af8._4_4_;
        fStack_1a90 = (float)uStack_2290 * (float)uStack_af0;
        fStack_1a8c = uStack_2290._4_4_ * uStack_af0._4_4_;
        fStack_1a88 = (float)uStack_2288 * (float)uStack_ae8;
        fVar79 = local_1aa0 + fVar79;
        fVar81 = fStack_1a9c + fVar81;
        fVar82 = fStack_1a98 + fVar82;
        fVar83 = fStack_1a94 + fVar83;
        fVar84 = fStack_1a90 + fVar84;
        fVar85 = fStack_1a8c + fVar85;
        fVar86 = fStack_1a88 + fVar86;
        fVar87 = uStack_2288._4_4_ + fVar87;
        local_2a00 = CONCAT44(fVar81,fVar79);
        uStack_29f8 = CONCAT44(fVar83,fVar82);
        uStack_29f0 = CONCAT44(fVar85,fVar84);
        uStack_29e8 = CONCAT44(fVar87,fVar86);
        local_aa0 = (float)local_2300;
        fStack_a9c = local_2300._4_4_;
        fStack_a98 = (float)uStack_22f8;
        fStack_a94 = uStack_22f8._4_4_;
        fStack_a90 = (float)uStack_22f0;
        fStack_a8c = uStack_22f0._4_4_;
        fStack_a88 = (float)uStack_22e8;
        fStack_1a44 = uStack_22e8._4_4_;
        local_1a60 = (float)local_2300 * (float)local_c80;
        fStack_1a5c = local_2300._4_4_ * local_c80._4_4_;
        fStack_1a58 = (float)uStack_22f8 * (float)uStack_c78;
        fStack_1a54 = uStack_22f8._4_4_ * uStack_c78._4_4_;
        fStack_1a50 = (float)uStack_22f0 * (float)uStack_c70;
        fStack_1a4c = uStack_22f0._4_4_ * uStack_c70._4_4_;
        fStack_1a48 = (float)uStack_22e8 * (float)uStack_c68;
        fVar79 = local_1a60 + fVar79;
        fVar81 = fStack_1a5c + fVar81;
        fVar82 = fStack_1a58 + fVar82;
        fVar83 = fStack_1a54 + fVar83;
        fVar84 = fStack_1a50 + fVar84;
        fVar85 = fStack_1a4c + fVar85;
        fVar86 = fStack_1a48 + fVar86;
        fVar87 = uStack_22e8._4_4_ + fVar87;
        local_2a60 = CONCAT44(fVar81,fVar79);
        uStack_2a58 = CONCAT44(fVar83,fVar82);
        uStack_2a50 = CONCAT44(fVar85,fVar84);
        uStack_2a48 = CONCAT44(fVar87,fVar86);
        local_a60 = (float)local_2360;
        fStack_a5c = local_2360._4_4_;
        fStack_a58 = (float)uStack_2358;
        fStack_a54 = uStack_2358._4_4_;
        fStack_a50 = (float)uStack_2350;
        fStack_a4c = uStack_2350._4_4_;
        fStack_a48 = (float)uStack_2348;
        fStack_1a04 = uStack_2348._4_4_;
        local_a80._0_4_ = (float)local_2a40;
        local_a80._4_4_ = (float)((ulong)local_2a40 >> 0x20);
        uStack_a78._0_4_ = (float)uStack_2a38;
        uStack_a78._4_4_ = (float)((ulong)uStack_2a38 >> 0x20);
        uStack_a70._0_4_ = (float)uStack_2a30;
        uStack_a70._4_4_ = (float)((ulong)uStack_2a30 >> 0x20);
        uStack_a68._0_4_ = (float)uStack_2a28;
        local_1a20 = (float)local_2360 * (float)local_a80;
        fStack_1a1c = local_2360._4_4_ * local_a80._4_4_;
        fStack_1a18 = (float)uStack_2358 * (float)uStack_a78;
        fStack_1a14 = uStack_2358._4_4_ * uStack_a78._4_4_;
        fStack_1a10 = (float)uStack_2350 * (float)uStack_a70;
        fStack_1a0c = uStack_2350._4_4_ * uStack_a70._4_4_;
        fStack_1a08 = (float)uStack_2348 * (float)uStack_a68;
        fVar79 = local_1a20 + fVar79;
        fVar81 = fStack_1a1c + fVar81;
        fVar82 = fStack_1a18 + fVar82;
        fVar83 = fStack_1a14 + fVar83;
        fVar84 = fStack_1a10 + fVar84;
        fVar85 = fStack_1a0c + fVar85;
        fVar86 = fStack_1a08 + fVar86;
        fVar87 = uStack_2348._4_4_ + fVar87;
        local_2ac0 = CONCAT44(fVar81,fVar79);
        uStack_2ab8 = CONCAT44(fVar83,fVar82);
        uStack_2ab0 = CONCAT44(fVar85,fVar84);
        uStack_2aa8 = CONCAT44(fVar87,fVar86);
        local_a20 = (float)local_23c0;
        fStack_a1c = local_23c0._4_4_;
        fStack_a18 = (float)uStack_23b8;
        fStack_a14 = uStack_23b8._4_4_;
        fStack_a10 = (float)uStack_23b0;
        fStack_a0c = uStack_23b0._4_4_;
        fStack_a08 = (float)uStack_23a8;
        fStack_19c4 = uStack_23a8._4_4_;
        local_a40._0_4_ = (float)local_2d40;
        local_a40._4_4_ = (float)((ulong)local_2d40 >> 0x20);
        uStack_a38._0_4_ = (float)uStack_2d38;
        uStack_a38._4_4_ = (float)((ulong)uStack_2d38 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_2d30;
        uStack_a30._4_4_ = (float)((ulong)uStack_2d30 >> 0x20);
        uStack_a28._0_4_ = (float)uStack_2d28;
        local_19e0 = (float)local_23c0 * (float)local_a40;
        fStack_19dc = local_23c0._4_4_ * local_a40._4_4_;
        fStack_19d8 = (float)uStack_23b8 * (float)uStack_a38;
        fStack_19d4 = uStack_23b8._4_4_ * uStack_a38._4_4_;
        fStack_19d0 = (float)uStack_23b0 * (float)uStack_a30;
        fStack_19cc = uStack_23b0._4_4_ * uStack_a30._4_4_;
        fStack_19c8 = (float)uStack_23a8 * (float)uStack_a28;
        fVar79 = local_19e0 + fVar79;
        fVar81 = fStack_19dc + fVar81;
        fVar82 = fStack_19d8 + fVar82;
        fVar83 = fStack_19d4 + fVar83;
        fVar84 = fStack_19d0 + fVar84;
        fVar85 = fStack_19cc + fVar85;
        fVar86 = fStack_19c8 + fVar86;
        fVar87 = uStack_23a8._4_4_ + fVar87;
        local_2b20 = CONCAT44(fVar81,fVar79);
        uStack_2b18 = CONCAT44(fVar83,fVar82);
        uStack_2b10 = CONCAT44(fVar85,fVar84);
        uStack_2b08 = CONCAT44(fVar87,fVar86);
        local_9e0 = (float)local_2420;
        fStack_9dc = local_2420._4_4_;
        fStack_9d8 = (float)uStack_2418;
        fStack_9d4 = uStack_2418._4_4_;
        fStack_9d0 = (float)uStack_2410;
        fStack_9cc = uStack_2410._4_4_;
        fStack_9c8 = (float)uStack_2408;
        fStack_1984 = uStack_2408._4_4_;
        local_19a0 = (float)local_2420 * (float)local_bc0;
        fStack_199c = local_2420._4_4_ * local_bc0._4_4_;
        fStack_1998 = (float)uStack_2418 * (float)uStack_bb8;
        fStack_1994 = uStack_2418._4_4_ * uStack_bb8._4_4_;
        fStack_1990 = (float)uStack_2410 * (float)uStack_bb0;
        fStack_198c = uStack_2410._4_4_ * uStack_bb0._4_4_;
        fStack_1988 = (float)uStack_2408 * (float)uStack_ba8;
        fVar79 = local_19a0 + fVar79;
        fVar81 = fStack_199c + fVar81;
        fVar82 = fStack_1998 + fVar82;
        fVar83 = fStack_1994 + fVar83;
        fVar84 = fStack_1990 + fVar84;
        fVar85 = fStack_198c + fVar85;
        fVar86 = fStack_1988 + fVar86;
        fVar87 = uStack_2408._4_4_ + fVar87;
        local_2b80 = CONCAT44(fVar81,fVar79);
        uStack_2b78 = CONCAT44(fVar83,fVar82);
        uStack_2b70 = CONCAT44(fVar85,fVar84);
        uStack_2b68 = CONCAT44(fVar87,fVar86);
        local_9a0 = (float)local_2480;
        fStack_99c = local_2480._4_4_;
        fStack_998 = (float)uStack_2478;
        fStack_994 = uStack_2478._4_4_;
        fStack_990 = (float)uStack_2470;
        fStack_98c = uStack_2470._4_4_;
        fStack_988 = (float)uStack_2468;
        fStack_1944 = uStack_2468._4_4_;
        local_9c0._0_4_ = (float)local_2b60;
        local_9c0._4_4_ = (float)((ulong)local_2b60 >> 0x20);
        uStack_9b8._0_4_ = (float)uStack_2b58;
        uStack_9b8._4_4_ = (float)((ulong)uStack_2b58 >> 0x20);
        uStack_9b0._0_4_ = (float)uStack_2b50;
        uStack_9b0._4_4_ = (float)((ulong)uStack_2b50 >> 0x20);
        uStack_9a8._0_4_ = (float)uStack_2b48;
        local_1960 = (float)local_2480 * (float)local_9c0;
        fStack_195c = local_2480._4_4_ * local_9c0._4_4_;
        fStack_1958 = (float)uStack_2478 * (float)uStack_9b8;
        fStack_1954 = uStack_2478._4_4_ * uStack_9b8._4_4_;
        fStack_1950 = (float)uStack_2470 * (float)uStack_9b0;
        fStack_194c = uStack_2470._4_4_ * uStack_9b0._4_4_;
        fStack_1948 = (float)uStack_2468 * (float)uStack_9a8;
        fVar79 = local_1960 + fVar79;
        fVar81 = fStack_195c + fVar81;
        fVar82 = fStack_1958 + fVar82;
        fVar83 = fStack_1954 + fVar83;
        fVar84 = fStack_1950 + fVar84;
        fVar85 = fStack_194c + fVar85;
        fVar86 = fStack_1948 + fVar86;
        fVar87 = uStack_2468._4_4_ + fVar87;
        local_2be0 = CONCAT44(fVar81,fVar79);
        uStack_2bd8 = CONCAT44(fVar83,fVar82);
        uStack_2bd0 = CONCAT44(fVar85,fVar84);
        uStack_2bc8 = CONCAT44(fVar87,fVar86);
        local_960 = (float)local_24e0;
        fStack_95c = local_24e0._4_4_;
        fStack_958 = (float)uStack_24d8;
        fStack_954 = uStack_24d8._4_4_;
        fStack_950 = (float)uStack_24d0;
        fStack_94c = uStack_24d0._4_4_;
        fStack_948 = (float)uStack_24c8;
        fStack_1904 = uStack_24c8._4_4_;
        local_980._0_4_ = (float)local_2e60;
        local_980._4_4_ = (float)((ulong)local_2e60 >> 0x20);
        uStack_978._0_4_ = (float)uStack_2e58;
        uStack_978._4_4_ = (float)((ulong)uStack_2e58 >> 0x20);
        uStack_970._0_4_ = (float)uStack_2e50;
        uStack_970._4_4_ = (float)((ulong)uStack_2e50 >> 0x20);
        uStack_968._0_4_ = (float)uStack_2e48;
        local_1920 = (float)local_24e0 * (float)local_980;
        fStack_191c = local_24e0._4_4_ * local_980._4_4_;
        fStack_1918 = (float)uStack_24d8 * (float)uStack_978;
        fStack_1914 = uStack_24d8._4_4_ * uStack_978._4_4_;
        fStack_1910 = (float)uStack_24d0 * (float)uStack_970;
        fStack_190c = uStack_24d0._4_4_ * uStack_970._4_4_;
        fStack_1908 = (float)uStack_24c8 * (float)uStack_968;
        local_20c0 = CONCAT44(fStack_191c + fVar81,local_1920 + fVar79);
        uStack_20b8 = CONCAT44(fStack_1914 + fVar83,fStack_1918 + fVar82);
        uStack_20b0 = CONCAT44(fStack_190c + fVar85,fStack_1910 + fVar84);
        uStack_20a8 = CONCAT44(uStack_24c8._4_4_ + fVar87,fStack_1908 + fVar86);
        local_3a60 = local_3c90 + 0x38;
        local_2c80 = *(undefined8 *)local_3a60;
        uStack_2c78 = *(undefined8 *)(local_3c90 + 0x3a);
        uStack_2c70 = *(undefined8 *)(local_3c90 + 0x3c);
        uStack_2c68 = *(undefined8 *)(local_3c90 + 0x3e);
        local_3a68 = local_3c98 + 0x38;
        local_2da0 = *(undefined8 *)local_3a68;
        uStack_2d98 = *(undefined8 *)(local_3c98 + 0x3a);
        uStack_2d90 = *(undefined8 *)(local_3c98 + 0x3c);
        uStack_2d88 = *(undefined8 *)(local_3c98 + 0x3e);
        local_3a70 = local_3ca0 + 0x38;
        local_2ec0 = *(undefined8 *)local_3a70;
        uStack_2eb8 = *(undefined8 *)(local_3ca0 + 0x3a);
        uStack_2eb0 = *(undefined8 *)(local_3ca0 + 0x3c);
        uStack_2ea8 = *(undefined8 *)(local_3ca0 + 0x3e);
        local_3a78 = local_3c90 + 0x40;
        local_2ce0 = *(undefined8 *)local_3a78;
        uStack_2cd8 = *(undefined8 *)(local_3c90 + 0x42);
        uStack_2cd0 = *(undefined8 *)(local_3c90 + 0x44);
        uStack_2cc8 = *(undefined8 *)(local_3c90 + 0x46);
        local_3a80 = local_3c98 + 0x40;
        local_2e00 = *(undefined8 *)local_3a80;
        uStack_2df8 = *(undefined8 *)(local_3c98 + 0x42);
        uStack_2df0 = *(undefined8 *)(local_3c98 + 0x44);
        uStack_2de8 = *(undefined8 *)(local_3c98 + 0x46);
        local_3a88 = local_3ca0 + 0x40;
        local_2f20 = *(undefined8 *)local_3a88;
        uStack_2f18 = *(undefined8 *)(local_3ca0 + 0x42);
        uStack_2f10 = *(undefined8 *)(local_3ca0 + 0x44);
        uStack_2f08 = *(undefined8 *)(local_3ca0 + 0x46);
        local_2088 = local_3c40 + 0x10;
        *(undefined8 *)local_2088 = local_20c0;
        *(undefined8 *)(local_3c40 + 0x12) = uStack_20b8;
        *(undefined8 *)(local_3c40 + 0x14) = uStack_20b0;
        *(undefined8 *)(local_3c40 + 0x16) = uStack_20a8;
        local_2c40 = local_3c20;
        uStack_2c38 = uStack_3c18;
        uStack_2c30 = uStack_3c10;
        uStack_2c28 = uStack_3c08;
        local_920 = (float)local_21e0;
        fStack_91c = local_21e0._4_4_;
        fStack_918 = (float)uStack_21d8;
        fStack_914 = uStack_21d8._4_4_;
        fStack_910 = (float)uStack_21d0;
        fStack_90c = uStack_21d0._4_4_;
        fStack_908 = (float)uStack_21c8;
        fStack_18c4 = uStack_21c8._4_4_;
        local_18e0 = (float)local_21e0 * (float)local_b00;
        fStack_18dc = local_21e0._4_4_ * local_b00._4_4_;
        fStack_18d8 = (float)uStack_21d8 * (float)uStack_af8;
        fStack_18d4 = uStack_21d8._4_4_ * uStack_af8._4_4_;
        fStack_18d0 = (float)uStack_21d0 * (float)uStack_af0;
        fStack_18cc = uStack_21d0._4_4_ * uStack_af0._4_4_;
        fStack_18c8 = (float)uStack_21c8 * (float)uStack_ae8;
        local_1900 = local_3c20;
        uStack_18f8 = uStack_3c18;
        uStack_18f0 = uStack_3c10;
        uStack_18e8 = uStack_3c08;
        local_2ca0 = CONCAT44(fStack_18dc + local_1fc0._4_4_,local_18e0 + (float)local_1fc0);
        uStack_2c98 = CONCAT44(fStack_18d4 + uStack_1fb8._4_4_,fStack_18d8 + (float)uStack_1fb8);
        uStack_2c90 = CONCAT44(fStack_18cc + uStack_1fb0._4_4_,fStack_18d0 + (float)uStack_1fb0);
        uStack_2c88 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_18c8 + (float)uStack_1fa8);
        local_8e0 = (float)local_2240;
        fStack_8dc = local_2240._4_4_;
        fStack_8d8 = (float)uStack_2238;
        fStack_8d4 = uStack_2238._4_4_;
        fStack_8d0 = (float)uStack_2230;
        fStack_8cc = uStack_2230._4_4_;
        fStack_8c8 = (float)uStack_2228;
        fStack_1884 = uStack_2228._4_4_;
        local_900._0_4_ = (float)local_2c80;
        local_900._4_4_ = (float)((ulong)local_2c80 >> 0x20);
        uStack_8f8._0_4_ = (float)uStack_2c78;
        uStack_8f8._4_4_ = (float)((ulong)uStack_2c78 >> 0x20);
        uStack_8f0._0_4_ = (float)uStack_2c70;
        uStack_8f0._4_4_ = (float)((ulong)uStack_2c70 >> 0x20);
        uStack_8e8._0_4_ = (float)uStack_2c68;
        local_18a0 = (float)local_2240 * (float)local_900;
        fStack_189c = local_2240._4_4_ * local_900._4_4_;
        fStack_1898 = (float)uStack_2238 * (float)uStack_8f8;
        fStack_1894 = uStack_2238._4_4_ * uStack_8f8._4_4_;
        fStack_1890 = (float)uStack_2230 * (float)uStack_8f0;
        fStack_188c = uStack_2230._4_4_ * uStack_8f0._4_4_;
        fStack_1888 = (float)uStack_2228 * (float)uStack_8e8;
        fVar79 = local_18a0 + local_18e0 + (float)local_1fc0;
        fVar81 = fStack_189c + fStack_18dc + local_1fc0._4_4_;
        fVar82 = fStack_1898 + fStack_18d8 + (float)uStack_1fb8;
        fVar83 = fStack_1894 + fStack_18d4 + uStack_1fb8._4_4_;
        fVar84 = fStack_1890 + fStack_18d0 + (float)uStack_1fb0;
        fVar85 = fStack_188c + fStack_18cc + uStack_1fb0._4_4_;
        fVar86 = fStack_1888 + fStack_18c8 + (float)uStack_1fa8;
        uStack_2228._4_4_ = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_2d00 = CONCAT44(fVar81,fVar79);
        uStack_2cf8 = CONCAT44(fVar83,fVar82);
        uStack_2cf0 = CONCAT44(fVar85,fVar84);
        uStack_2ce8 = CONCAT44(uStack_2228._4_4_,fVar86);
        local_8a0 = (float)local_22a0;
        fStack_89c = local_22a0._4_4_;
        fStack_898 = (float)uStack_2298;
        fStack_894 = uStack_2298._4_4_;
        fStack_890 = (float)uStack_2290;
        fStack_88c = uStack_2290._4_4_;
        fStack_888 = (float)uStack_2288;
        fStack_1844 = uStack_2288._4_4_;
        local_8c0._0_4_ = (float)local_2ce0;
        local_8c0._4_4_ = (float)((ulong)local_2ce0 >> 0x20);
        uStack_8b8._0_4_ = (float)uStack_2cd8;
        uStack_8b8._4_4_ = (float)((ulong)uStack_2cd8 >> 0x20);
        uStack_8b0._0_4_ = (float)uStack_2cd0;
        uStack_8b0._4_4_ = (float)((ulong)uStack_2cd0 >> 0x20);
        uStack_8a8._0_4_ = (float)uStack_2cc8;
        local_1860 = (float)local_22a0 * (float)local_8c0;
        fStack_185c = local_22a0._4_4_ * local_8c0._4_4_;
        fStack_1858 = (float)uStack_2298 * (float)uStack_8b8;
        fStack_1854 = uStack_2298._4_4_ * uStack_8b8._4_4_;
        fStack_1850 = (float)uStack_2290 * (float)uStack_8b0;
        fStack_184c = uStack_2290._4_4_ * uStack_8b0._4_4_;
        fStack_1848 = (float)uStack_2288 * (float)uStack_8a8;
        fVar79 = local_1860 + fVar79;
        fVar81 = fStack_185c + fVar81;
        fVar82 = fStack_1858 + fVar82;
        fVar83 = fStack_1854 + fVar83;
        fVar84 = fStack_1850 + fVar84;
        fVar85 = fStack_184c + fVar85;
        fVar86 = fStack_1848 + fVar86;
        uStack_2288._4_4_ = uStack_2288._4_4_ + uStack_2228._4_4_;
        local_2d60 = CONCAT44(fVar81,fVar79);
        uStack_2d58 = CONCAT44(fVar83,fVar82);
        uStack_2d50 = CONCAT44(fVar85,fVar84);
        uStack_2d48 = CONCAT44(uStack_2288._4_4_,fVar86);
        local_860 = (float)local_2300;
        fStack_85c = local_2300._4_4_;
        fStack_858 = (float)uStack_22f8;
        fStack_854 = uStack_22f8._4_4_;
        fStack_850 = (float)uStack_22f0;
        fStack_84c = uStack_22f0._4_4_;
        fStack_848 = (float)uStack_22e8;
        fStack_1804 = uStack_22e8._4_4_;
        local_1820 = (float)local_2300 * (float)local_a40;
        fStack_181c = local_2300._4_4_ * local_a40._4_4_;
        fStack_1818 = (float)uStack_22f8 * (float)uStack_a38;
        fStack_1814 = uStack_22f8._4_4_ * uStack_a38._4_4_;
        fStack_1810 = (float)uStack_22f0 * (float)uStack_a30;
        fStack_180c = uStack_22f0._4_4_ * uStack_a30._4_4_;
        fStack_1808 = (float)uStack_22e8 * (float)uStack_a28;
        fVar79 = local_1820 + fVar79;
        fVar81 = fStack_181c + fVar81;
        fVar82 = fStack_1818 + fVar82;
        fVar83 = fStack_1814 + fVar83;
        fVar84 = fStack_1810 + fVar84;
        fVar85 = fStack_180c + fVar85;
        fVar86 = fStack_1808 + fVar86;
        uStack_22e8._4_4_ = uStack_22e8._4_4_ + uStack_2288._4_4_;
        local_2dc0 = CONCAT44(fVar81,fVar79);
        uStack_2db8 = CONCAT44(fVar83,fVar82);
        uStack_2db0 = CONCAT44(fVar85,fVar84);
        uStack_2da8 = CONCAT44(uStack_22e8._4_4_,fVar86);
        local_820 = (float)local_2360;
        fStack_81c = local_2360._4_4_;
        fStack_818 = (float)uStack_2358;
        fStack_814 = uStack_2358._4_4_;
        fStack_810 = (float)uStack_2350;
        fStack_80c = uStack_2350._4_4_;
        fStack_808 = (float)uStack_2348;
        fStack_17c4 = uStack_2348._4_4_;
        local_840._0_4_ = (float)local_2da0;
        local_840._4_4_ = (float)((ulong)local_2da0 >> 0x20);
        uStack_838._0_4_ = (float)uStack_2d98;
        uStack_838._4_4_ = (float)((ulong)uStack_2d98 >> 0x20);
        uStack_830._0_4_ = (float)uStack_2d90;
        uStack_830._4_4_ = (float)((ulong)uStack_2d90 >> 0x20);
        uStack_828._0_4_ = (float)uStack_2d88;
        local_17e0 = (float)local_2360 * (float)local_840;
        fStack_17dc = local_2360._4_4_ * local_840._4_4_;
        fStack_17d8 = (float)uStack_2358 * (float)uStack_838;
        fStack_17d4 = uStack_2358._4_4_ * uStack_838._4_4_;
        fStack_17d0 = (float)uStack_2350 * (float)uStack_830;
        fStack_17cc = uStack_2350._4_4_ * uStack_830._4_4_;
        fStack_17c8 = (float)uStack_2348 * (float)uStack_828;
        fVar79 = local_17e0 + fVar79;
        fVar81 = fStack_17dc + fVar81;
        fVar82 = fStack_17d8 + fVar82;
        fVar83 = fStack_17d4 + fVar83;
        fVar84 = fStack_17d0 + fVar84;
        fVar85 = fStack_17cc + fVar85;
        fVar86 = fStack_17c8 + fVar86;
        uStack_2348._4_4_ = uStack_2348._4_4_ + uStack_22e8._4_4_;
        local_2e20 = CONCAT44(fVar81,fVar79);
        uStack_2e18 = CONCAT44(fVar83,fVar82);
        uStack_2e10 = CONCAT44(fVar85,fVar84);
        uStack_2e08 = CONCAT44(uStack_2348._4_4_,fVar86);
        local_7e0 = (float)local_23c0;
        fStack_7dc = local_23c0._4_4_;
        fStack_7d8 = (float)uStack_23b8;
        fStack_7d4 = uStack_23b8._4_4_;
        fStack_7d0 = (float)uStack_23b0;
        fStack_7cc = uStack_23b0._4_4_;
        fStack_7c8 = (float)uStack_23a8;
        fStack_1784 = uStack_23a8._4_4_;
        local_800._0_4_ = (float)local_2e00;
        local_800._4_4_ = (float)((ulong)local_2e00 >> 0x20);
        uStack_7f8._0_4_ = (float)uStack_2df8;
        uStack_7f8._4_4_ = (float)((ulong)uStack_2df8 >> 0x20);
        uStack_7f0._0_4_ = (float)uStack_2df0;
        uStack_7f0._4_4_ = (float)((ulong)uStack_2df0 >> 0x20);
        uStack_7e8._0_4_ = (float)uStack_2de8;
        local_17a0 = (float)local_23c0 * (float)local_800;
        fStack_179c = local_23c0._4_4_ * local_800._4_4_;
        fStack_1798 = (float)uStack_23b8 * (float)uStack_7f8;
        fStack_1794 = uStack_23b8._4_4_ * uStack_7f8._4_4_;
        fStack_1790 = (float)uStack_23b0 * (float)uStack_7f0;
        fStack_178c = uStack_23b0._4_4_ * uStack_7f0._4_4_;
        fStack_1788 = (float)uStack_23a8 * (float)uStack_7e8;
        fVar79 = local_17a0 + fVar79;
        fVar81 = fStack_179c + fVar81;
        fVar82 = fStack_1798 + fVar82;
        fVar83 = fStack_1794 + fVar83;
        fVar84 = fStack_1790 + fVar84;
        fVar85 = fStack_178c + fVar85;
        fVar86 = fStack_1788 + fVar86;
        uStack_23a8._4_4_ = uStack_23a8._4_4_ + uStack_2348._4_4_;
        local_2e80 = CONCAT44(fVar81,fVar79);
        uStack_2e78 = CONCAT44(fVar83,fVar82);
        uStack_2e70 = CONCAT44(fVar85,fVar84);
        uStack_2e68 = CONCAT44(uStack_23a8._4_4_,fVar86);
        local_7a0 = (float)local_2420;
        fStack_79c = local_2420._4_4_;
        fStack_798 = (float)uStack_2418;
        fStack_794 = uStack_2418._4_4_;
        fStack_790 = (float)uStack_2410;
        fStack_78c = uStack_2410._4_4_;
        fStack_788 = (float)uStack_2408;
        fStack_1744 = uStack_2408._4_4_;
        local_1760 = (float)local_2420 * (float)local_980;
        fStack_175c = local_2420._4_4_ * local_980._4_4_;
        fStack_1758 = (float)uStack_2418 * (float)uStack_978;
        fStack_1754 = uStack_2418._4_4_ * uStack_978._4_4_;
        fStack_1750 = (float)uStack_2410 * (float)uStack_970;
        fStack_174c = uStack_2410._4_4_ * uStack_970._4_4_;
        fStack_1748 = (float)uStack_2408 * (float)uStack_968;
        fVar79 = local_1760 + fVar79;
        fVar81 = fStack_175c + fVar81;
        fVar82 = fStack_1758 + fVar82;
        fVar83 = fStack_1754 + fVar83;
        fVar84 = fStack_1750 + fVar84;
        fVar85 = fStack_174c + fVar85;
        fVar86 = fStack_1748 + fVar86;
        uStack_2408._4_4_ = uStack_2408._4_4_ + uStack_23a8._4_4_;
        local_2ee0 = CONCAT44(fVar81,fVar79);
        uStack_2ed8 = CONCAT44(fVar83,fVar82);
        uStack_2ed0 = CONCAT44(fVar85,fVar84);
        uStack_2ec8 = CONCAT44(uStack_2408._4_4_,fVar86);
        local_760 = (float)local_2480;
        fStack_75c = local_2480._4_4_;
        fStack_758 = (float)uStack_2478;
        fStack_754 = uStack_2478._4_4_;
        fStack_750 = (float)uStack_2470;
        fStack_74c = uStack_2470._4_4_;
        fStack_748 = (float)uStack_2468;
        fStack_1704 = uStack_2468._4_4_;
        local_780._0_4_ = (float)local_2ec0;
        local_780._4_4_ = (float)((ulong)local_2ec0 >> 0x20);
        uStack_778._0_4_ = (float)uStack_2eb8;
        uStack_778._4_4_ = (float)((ulong)uStack_2eb8 >> 0x20);
        uStack_770._0_4_ = (float)uStack_2eb0;
        uStack_770._4_4_ = (float)((ulong)uStack_2eb0 >> 0x20);
        uStack_768._0_4_ = (float)uStack_2ea8;
        local_1720 = (float)local_2480 * (float)local_780;
        fStack_171c = local_2480._4_4_ * local_780._4_4_;
        fStack_1718 = (float)uStack_2478 * (float)uStack_778;
        fStack_1714 = uStack_2478._4_4_ * uStack_778._4_4_;
        fStack_1710 = (float)uStack_2470 * (float)uStack_770;
        fStack_170c = uStack_2470._4_4_ * uStack_770._4_4_;
        fStack_1708 = (float)uStack_2468 * (float)uStack_768;
        fVar79 = local_1720 + fVar79;
        fVar81 = fStack_171c + fVar81;
        fVar82 = fStack_1718 + fVar82;
        fVar83 = fStack_1714 + fVar83;
        fVar84 = fStack_1710 + fVar84;
        fVar85 = fStack_170c + fVar85;
        fVar86 = fStack_1708 + fVar86;
        uStack_2468._4_4_ = uStack_2468._4_4_ + uStack_2408._4_4_;
        local_2f40 = CONCAT44(fVar81,fVar79);
        uStack_2f38 = CONCAT44(fVar83,fVar82);
        uStack_2f30 = CONCAT44(fVar85,fVar84);
        uStack_2f28 = CONCAT44(uStack_2468._4_4_,fVar86);
        local_720 = (float)local_24e0;
        fStack_71c = local_24e0._4_4_;
        fStack_718 = (float)uStack_24d8;
        fStack_714 = uStack_24d8._4_4_;
        fStack_710 = (float)uStack_24d0;
        fStack_70c = uStack_24d0._4_4_;
        fStack_708 = (float)uStack_24c8;
        fStack_16c4 = uStack_24c8._4_4_;
        local_740._0_4_ = (float)local_2f20;
        local_740._4_4_ = (float)((ulong)local_2f20 >> 0x20);
        uStack_738._0_4_ = (float)uStack_2f18;
        uStack_738._4_4_ = (float)((ulong)uStack_2f18 >> 0x20);
        uStack_730._0_4_ = (float)uStack_2f10;
        uStack_730._4_4_ = (float)((ulong)uStack_2f10 >> 0x20);
        uStack_728._0_4_ = (float)uStack_2f08;
        local_16e0 = (float)local_24e0 * (float)local_740;
        fStack_16dc = local_24e0._4_4_ * local_740._4_4_;
        fStack_16d8 = (float)uStack_24d8 * (float)uStack_738;
        fStack_16d4 = uStack_24d8._4_4_ * uStack_738._4_4_;
        fStack_16d0 = (float)uStack_24d0 * (float)uStack_730;
        fStack_16cc = uStack_24d0._4_4_ * uStack_730._4_4_;
        fStack_16c8 = (float)uStack_24c8 * (float)uStack_728;
        local_2100 = CONCAT44(fStack_16dc + fVar81,local_16e0 + fVar79);
        uStack_20f8 = CONCAT44(fStack_16d4 + fVar83,fStack_16d8 + fVar82);
        uStack_20f0 = CONCAT44(fStack_16cc + fVar85,fStack_16d0 + fVar84);
        uStack_20e8 = CONCAT44(uStack_24c8._4_4_ + uStack_2468._4_4_,fStack_16c8 + fVar86);
        local_20c8 = local_3c40 + 0x18;
        *(undefined8 *)local_20c8 = local_2100;
        *(undefined8 *)(local_3c40 + 0x1a) = uStack_20f8;
        *(undefined8 *)(local_3c40 + 0x1c) = uStack_20f0;
        *(undefined8 *)(local_3c40 + 0x1e) = uStack_20e8;
        local_3c90 = local_3c90 + 0x40;
        local_3c98 = local_3c98 + 0x40;
        local_3ca0 = local_3ca0 + 0x40;
        local_3c40 = local_3c40 + 0x20;
        local_3dc8 = local_3dc8 + 4;
        local_2f00 = uVar35;
        uStack_2ef8 = uVar36;
        uStack_2ef0 = uVar37;
        uStack_2ee8 = uVar38;
        local_2ea0 = uVar31;
        uStack_2e98 = uVar32;
        uStack_2e90 = uVar33;
        uStack_2e88 = uVar34;
        local_2e40 = uVar27;
        uStack_2e38 = uVar28;
        uStack_2e30 = uVar29;
        uStack_2e28 = uVar30;
        local_2de0 = uVar23;
        uStack_2dd8 = uVar24;
        uStack_2dd0 = uVar25;
        uStack_2dc8 = uVar26;
        local_2d80 = uVar19;
        uStack_2d78 = uVar20;
        uStack_2d70 = uVar21;
        uStack_2d68 = uVar22;
        local_2d20 = uVar15;
        uStack_2d18 = uVar16;
        uStack_2d10 = uVar17;
        uStack_2d08 = uVar18;
        local_2cc0 = uVar11;
        uStack_2cb8 = uVar12;
        uStack_2cb0 = uVar13;
        uStack_2ca8 = uVar14;
        local_2c60 = uVar7;
        uStack_2c58 = uVar8;
        uStack_2c50 = uVar9;
        uStack_2c48 = uVar10;
        local_2c00 = uVar3;
        uStack_2bf8 = uVar4;
        uStack_2bf0 = uVar5;
        uStack_2be8 = uVar6;
        local_2bc0 = local_2e60;
        uStack_2bb8 = uStack_2e58;
        uStack_2bb0 = uStack_2e50;
        uStack_2ba8 = uStack_2e48;
        local_2ba0 = uVar35;
        uStack_2b98 = uVar36;
        uStack_2b90 = uVar37;
        uStack_2b88 = uVar38;
        local_2b40 = uVar31;
        uStack_2b38 = uVar32;
        uStack_2b30 = uVar33;
        uStack_2b28 = uVar34;
        local_2ae0 = uVar27;
        uStack_2ad8 = uVar28;
        uStack_2ad0 = uVar29;
        uStack_2ac8 = uVar30;
        local_2aa0 = local_2d40;
        uStack_2a98 = uStack_2d38;
        uStack_2a90 = uStack_2d30;
        uStack_2a88 = uStack_2d28;
        local_2a80 = uVar23;
        uStack_2a78 = uVar24;
        uStack_2a70 = uVar25;
        uStack_2a68 = uVar26;
        local_2a20 = uVar19;
        uStack_2a18 = uVar20;
        uStack_2a10 = uVar21;
        uStack_2a08 = uVar22;
        local_29c0 = uVar15;
        uStack_29b8 = uVar16;
        uStack_29b0 = uVar17;
        uStack_29a8 = uVar18;
        local_2980 = local_2c20;
        uStack_2978 = uStack_2c18;
        uStack_2970 = uStack_2c10;
        uStack_2968 = uStack_2c08;
        local_2960 = uVar11;
        uStack_2958 = uVar12;
        uStack_2950 = uVar13;
        uStack_2948 = uVar14;
        local_2900 = uVar7;
        uStack_28f8 = uVar8;
        uStack_28f0 = uVar9;
        uStack_28e8 = uVar10;
        local_28a0 = uVar3;
        uStack_2898 = uVar4;
        uStack_2890 = uVar5;
        uStack_2888 = uVar6;
        local_2860 = local_2b00;
        uStack_2858 = uStack_2af8;
        uStack_2850 = uStack_2af0;
        uStack_2848 = uStack_2ae8;
        local_2840 = uVar35;
        uStack_2838 = uVar36;
        uStack_2830 = uVar37;
        uStack_2828 = uVar38;
        local_27e0 = uVar31;
        uStack_27d8 = uVar32;
        uStack_27d0 = uVar33;
        uStack_27c8 = uVar34;
        local_2780 = uVar27;
        uStack_2778 = uVar28;
        uStack_2770 = uVar29;
        uStack_2768 = uVar30;
        local_2740 = local_29e0;
        uStack_2738 = uStack_29d8;
        uStack_2730 = uStack_29d0;
        uStack_2728 = uStack_29c8;
        local_2720 = uVar23;
        uStack_2718 = uVar24;
        uStack_2710 = uVar25;
        uStack_2708 = uVar26;
        local_26c0 = uVar19;
        uStack_26b8 = uVar20;
        uStack_26b0 = uVar21;
        uStack_26a8 = uVar22;
        local_2660 = uVar15;
        uStack_2658 = uVar16;
        uStack_2650 = uVar17;
        uStack_2648 = uVar18;
        local_2620 = local_28c0;
        uStack_2618 = uStack_28b8;
        uStack_2610 = uStack_28b0;
        uStack_2608 = uStack_28a8;
        local_2600 = uVar11;
        uStack_25f8 = uVar12;
        uStack_25f0 = uVar13;
        uStack_25e8 = uVar14;
        local_25a0 = uVar7;
        uStack_2598 = uVar8;
        uStack_2590 = uVar9;
        uStack_2588 = uVar10;
        local_2540 = uVar3;
        uStack_2538 = uVar4;
        uStack_2530 = uVar5;
        uStack_2528 = uVar6;
        local_2500 = local_27a0;
        uStack_24f8 = uStack_2798;
        uStack_24f0 = uStack_2790;
        uStack_24e8 = uStack_2788;
        local_24e0 = uVar35;
        uStack_24d8 = uVar36;
        uStack_24d0 = uVar37;
        uStack_24c8 = uVar38;
        local_2480 = uVar31;
        uStack_2478 = uVar32;
        uStack_2470 = uVar33;
        uStack_2468 = uVar34;
        local_2420 = uVar27;
        uStack_2418 = uVar28;
        uStack_2410 = uVar29;
        uStack_2408 = uVar30;
        local_23e0 = local_2680;
        uStack_23d8 = uStack_2678;
        uStack_23d0 = uStack_2670;
        uStack_23c8 = uStack_2668;
        local_23c0 = uVar23;
        uStack_23b8 = uVar24;
        uStack_23b0 = uVar25;
        uStack_23a8 = uVar26;
        local_2360 = uVar19;
        uStack_2358 = uVar20;
        uStack_2350 = uVar21;
        uStack_2348 = uVar22;
        local_2300 = uVar15;
        uStack_22f8 = uVar16;
        uStack_22f0 = uVar17;
        uStack_22e8 = uVar18;
        local_22c0 = local_2560;
        uStack_22b8 = uStack_2558;
        uStack_22b0 = uStack_2550;
        uStack_22a8 = uStack_2548;
        local_22a0 = uVar11;
        uStack_2298 = uVar12;
        uStack_2290 = uVar13;
        uStack_2288 = uVar14;
        local_2240 = uVar7;
        uStack_2238 = uVar8;
        uStack_2230 = uVar9;
        uStack_2228 = uVar10;
        local_21e0 = uVar3;
        uStack_21d8 = uVar4;
        uStack_21d0 = uVar5;
        uStack_21c8 = uVar6;
        local_1fc0 = local_3c20;
        uStack_1fb8 = uStack_3c18;
        uStack_1fb0 = uStack_3c10;
        uStack_1fa8 = uStack_3c08;
        local_1f80 = local_2280;
        uStack_1f78 = uStack_2278;
        uStack_1f70 = uStack_2270;
        uStack_1f68 = uStack_2268;
        local_1f40 = local_22e0;
        uStack_1f38 = uStack_22d8;
        uStack_1f30 = uStack_22d0;
        uStack_1f28 = uStack_22c8;
        local_1f00 = local_2340;
        uStack_1ef8 = uStack_2338;
        uStack_1ef0 = uStack_2330;
        uStack_1ee8 = uStack_2328;
        local_1ec0 = local_23a0;
        uStack_1eb8 = uStack_2398;
        uStack_1eb0 = uStack_2390;
        uStack_1ea8 = uStack_2388;
        local_1e80 = local_2400;
        uStack_1e78 = uStack_23f8;
        uStack_1e70 = uStack_23f0;
        uStack_1e68 = uStack_23e8;
        local_1e40 = local_2460;
        uStack_1e38 = uStack_2458;
        uStack_1e30 = uStack_2450;
        uStack_1e28 = uStack_2448;
        local_1e00 = local_24c0;
        uStack_1df8 = uStack_24b8;
        uStack_1df0 = uStack_24b0;
        uStack_1de8 = uStack_24a8;
        local_1dc0 = local_2520;
        uStack_1db8 = uStack_2518;
        uStack_1db0 = uStack_2510;
        uStack_1da8 = uStack_2508;
        local_1d40 = local_25e0;
        uStack_1d38 = uStack_25d8;
        uStack_1d30 = uStack_25d0;
        uStack_1d28 = uStack_25c8;
        local_1d00 = local_2640;
        uStack_1cf8 = uStack_2638;
        uStack_1cf0 = uStack_2630;
        uStack_1ce8 = uStack_2628;
        local_1cc0 = local_26a0;
        uStack_1cb8 = uStack_2698;
        uStack_1cb0 = uStack_2690;
        uStack_1ca8 = uStack_2688;
        local_1c80 = local_2700;
        uStack_1c78 = uStack_26f8;
        uStack_1c70 = uStack_26f0;
        uStack_1c68 = uStack_26e8;
        local_1c40 = local_2760;
        uStack_1c38 = uStack_2758;
        uStack_1c30 = uStack_2750;
        uStack_1c28 = uStack_2748;
        local_1c00 = local_27c0;
        uStack_1bf8 = uStack_27b8;
        uStack_1bf0 = uStack_27b0;
        uStack_1be8 = uStack_27a8;
        local_1bc0 = local_2820;
        uStack_1bb8 = uStack_2818;
        uStack_1bb0 = uStack_2810;
        uStack_1ba8 = uStack_2808;
        local_1b80 = local_2880;
        uStack_1b78 = uStack_2878;
        uStack_1b70 = uStack_2870;
        uStack_1b68 = uStack_2868;
        local_1b00 = local_2940;
        uStack_1af8 = uStack_2938;
        uStack_1af0 = uStack_2930;
        uStack_1ae8 = uStack_2928;
        local_1ac0 = local_29a0;
        uStack_1ab8 = uStack_2998;
        uStack_1ab0 = uStack_2990;
        uStack_1aa8 = uStack_2988;
        local_1a80 = local_2a00;
        uStack_1a78 = uStack_29f8;
        uStack_1a70 = uStack_29f0;
        uStack_1a68 = uStack_29e8;
        local_1a40 = local_2a60;
        uStack_1a38 = uStack_2a58;
        uStack_1a30 = uStack_2a50;
        uStack_1a28 = uStack_2a48;
        local_1a00 = local_2ac0;
        uStack_19f8 = uStack_2ab8;
        uStack_19f0 = uStack_2ab0;
        uStack_19e8 = uStack_2aa8;
        local_19c0 = local_2b20;
        uStack_19b8 = uStack_2b18;
        uStack_19b0 = uStack_2b10;
        uStack_19a8 = uStack_2b08;
        local_1980 = local_2b80;
        uStack_1978 = uStack_2b78;
        uStack_1970 = uStack_2b70;
        uStack_1968 = uStack_2b68;
        local_1940 = local_2be0;
        uStack_1938 = uStack_2bd8;
        uStack_1930 = uStack_2bd0;
        uStack_1928 = uStack_2bc8;
        local_18c0 = local_2ca0;
        uStack_18b8 = uStack_2c98;
        uStack_18b0 = uStack_2c90;
        uStack_18a8 = uStack_2c88;
        local_1880 = local_2d00;
        uStack_1878 = uStack_2cf8;
        uStack_1870 = uStack_2cf0;
        uStack_1868 = uStack_2ce8;
        local_1840 = local_2d60;
        uStack_1838 = uStack_2d58;
        uStack_1830 = uStack_2d50;
        uStack_1828 = uStack_2d48;
        local_1800 = local_2dc0;
        uStack_17f8 = uStack_2db8;
        uStack_17f0 = uStack_2db0;
        uStack_17e8 = uStack_2da8;
        local_17c0 = local_2e20;
        uStack_17b8 = uStack_2e18;
        uStack_17b0 = uStack_2e10;
        uStack_17a8 = uStack_2e08;
        local_1780 = local_2e80;
        uStack_1778 = uStack_2e78;
        uStack_1770 = uStack_2e70;
        uStack_1768 = uStack_2e68;
        local_1740 = local_2ee0;
        uStack_1738 = uStack_2ed8;
        uStack_1730 = uStack_2ed0;
        uStack_1728 = uStack_2ec8;
        local_1700 = local_2f40;
        uStack_16f8 = uStack_2f38;
        uStack_16f0 = uStack_2f30;
        uStack_16e8 = uStack_2f28;
        local_1000 = local_2200;
        uStack_ff8 = uStack_21f8;
        uStack_ff0 = uStack_21f0;
        uStack_fe8 = uStack_21e8;
        fStack_fc4 = fStack_1f84;
        local_fc0 = local_2260;
        uStack_fb8 = uStack_2258;
        uStack_fb0 = uStack_2250;
        uStack_fa8 = uStack_2248;
        fStack_f84 = fStack_1f44;
        local_f80 = local_2560;
        uStack_f78 = uStack_2558;
        uStack_f70 = uStack_2550;
        uStack_f68 = uStack_2548;
        fStack_f44 = fStack_1f04;
        local_f40 = local_2320;
        uStack_f38 = uStack_2318;
        uStack_f30 = uStack_2310;
        uStack_f28 = uStack_2308;
        fStack_f04 = fStack_1ec4;
        local_f00 = local_2380;
        uStack_ef8 = uStack_2378;
        uStack_ef0 = uStack_2370;
        uStack_ee8 = uStack_2368;
        fStack_ec4 = fStack_1e84;
        local_ec0 = local_2680;
        uStack_eb8 = uStack_2678;
        uStack_eb0 = uStack_2670;
        uStack_ea8 = uStack_2668;
        fStack_e84 = fStack_1e44;
        local_e80 = local_2440;
        uStack_e78 = uStack_2438;
        uStack_e70 = uStack_2430;
        uStack_e68 = uStack_2428;
        fStack_e44 = fStack_1e04;
        local_e40 = local_24a0;
        uStack_e38 = uStack_2498;
        uStack_e30 = uStack_2490;
        uStack_e28 = uStack_2488;
        fStack_e04 = fStack_1dc4;
        local_e00 = local_27a0;
        uStack_df8 = uStack_2798;
        uStack_df0 = uStack_2790;
        uStack_de8 = uStack_2788;
        fStack_dc4 = fStack_1d84;
        local_dc0 = local_2560;
        uStack_db8 = uStack_2558;
        uStack_db0 = uStack_2550;
        uStack_da8 = uStack_2548;
        fStack_d84 = fStack_1d44;
        local_d80 = local_25c0;
        uStack_d78 = uStack_25b8;
        uStack_d70 = uStack_25b0;
        uStack_d68 = uStack_25a8;
        fStack_d44 = fStack_1d04;
        local_d40 = local_28c0;
        uStack_d38 = uStack_28b8;
        uStack_d30 = uStack_28b0;
        uStack_d28 = uStack_28a8;
        fStack_d04 = fStack_1cc4;
        local_d00 = local_2680;
        uStack_cf8 = uStack_2678;
        uStack_cf0 = uStack_2670;
        uStack_ce8 = uStack_2668;
        fStack_cc4 = fStack_1c84;
        local_cc0 = local_26e0;
        uStack_cb8 = uStack_26d8;
        uStack_cb0 = uStack_26d0;
        uStack_ca8 = uStack_26c8;
        fStack_c84 = fStack_1c44;
        local_c80 = local_29e0;
        uStack_c78 = uStack_29d8;
        uStack_c70 = uStack_29d0;
        uStack_c68 = uStack_29c8;
        fStack_c44 = fStack_1c04;
        local_c40 = local_27a0;
        uStack_c38 = uStack_2798;
        uStack_c30 = uStack_2790;
        uStack_c28 = uStack_2788;
        fStack_c04 = fStack_1bc4;
        local_c00 = local_2800;
        uStack_bf8 = uStack_27f8;
        uStack_bf0 = uStack_27f0;
        uStack_be8 = uStack_27e8;
        fStack_bc4 = fStack_1b84;
        local_bc0 = local_2b00;
        uStack_bb8 = uStack_2af8;
        uStack_bb0 = uStack_2af0;
        uStack_ba8 = uStack_2ae8;
        fStack_b84 = fStack_1b44;
        local_b80 = local_28c0;
        uStack_b78 = uStack_28b8;
        uStack_b70 = uStack_28b0;
        uStack_b68 = uStack_28a8;
        fStack_b44 = fStack_1b04;
        local_b40 = local_2920;
        uStack_b38 = uStack_2918;
        uStack_b30 = uStack_2910;
        uStack_b28 = uStack_2908;
        fStack_b04 = fStack_1ac4;
        local_b00 = local_2c20;
        uStack_af8 = uStack_2c18;
        uStack_af0 = uStack_2c10;
        uStack_ae8 = uStack_2c08;
        fStack_ac4 = fStack_1a84;
        local_ac0 = local_29e0;
        uStack_ab8 = uStack_29d8;
        uStack_ab0 = uStack_29d0;
        uStack_aa8 = uStack_29c8;
        fStack_a84 = fStack_1a44;
        local_a80 = local_2a40;
        uStack_a78 = uStack_2a38;
        uStack_a70 = uStack_2a30;
        uStack_a68 = uStack_2a28;
        fStack_a44 = fStack_1a04;
        local_a40 = local_2d40;
        uStack_a38 = uStack_2d38;
        uStack_a30 = uStack_2d30;
        uStack_a28 = uStack_2d28;
        fStack_a04 = fStack_19c4;
        local_a00 = local_2b00;
        uStack_9f8 = uStack_2af8;
        uStack_9f0 = uStack_2af0;
        uStack_9e8 = uStack_2ae8;
        fStack_9c4 = fStack_1984;
        local_9c0 = local_2b60;
        uStack_9b8 = uStack_2b58;
        uStack_9b0 = uStack_2b50;
        uStack_9a8 = uStack_2b48;
        fStack_984 = fStack_1944;
        local_980 = local_2e60;
        uStack_978 = uStack_2e58;
        uStack_970 = uStack_2e50;
        uStack_968 = uStack_2e48;
        fStack_944 = fStack_1904;
        local_940 = local_2c20;
        uStack_938 = uStack_2c18;
        uStack_930 = uStack_2c10;
        uStack_928 = uStack_2c08;
        fStack_904 = fStack_18c4;
        local_900 = local_2c80;
        uStack_8f8 = uStack_2c78;
        uStack_8f0 = uStack_2c70;
        uStack_8e8 = uStack_2c68;
        fStack_8c4 = fStack_1884;
        local_8c0 = local_2ce0;
        uStack_8b8 = uStack_2cd8;
        uStack_8b0 = uStack_2cd0;
        uStack_8a8 = uStack_2cc8;
        fStack_884 = fStack_1844;
        local_880 = local_2d40;
        uStack_878 = uStack_2d38;
        uStack_870 = uStack_2d30;
        uStack_868 = uStack_2d28;
        fStack_844 = fStack_1804;
        local_840 = local_2da0;
        uStack_838 = uStack_2d98;
        uStack_830 = uStack_2d90;
        uStack_828 = uStack_2d88;
        fStack_804 = fStack_17c4;
        local_800 = local_2e00;
        uStack_7f8 = uStack_2df8;
        uStack_7f0 = uStack_2df0;
        uStack_7e8 = uStack_2de8;
        fStack_7c4 = fStack_1784;
        local_7c0 = local_2e60;
        uStack_7b8 = uStack_2e58;
        uStack_7b0 = uStack_2e50;
        uStack_7a8 = uStack_2e48;
        fStack_784 = fStack_1744;
        local_780 = local_2ec0;
        uStack_778 = uStack_2eb8;
        uStack_770 = uStack_2eb0;
        uStack_768 = uStack_2ea8;
        fStack_744 = fStack_1704;
        local_740 = local_2f20;
        uStack_738 = uStack_2f18;
        uStack_730 = uStack_2f10;
        uStack_728 = uStack_2f08;
        fStack_704 = fStack_16c4;
      }
      for (; local_3dc8 + 1 < local_3b80; local_3dc8 = local_3dc8 + 2) {
        local_3a90 = local_3c90;
        local_2f80 = *(undefined8 *)local_3c90;
        uStack_2f78 = *(undefined8 *)(local_3c90 + 2);
        uStack_2f70 = *(undefined8 *)(local_3c90 + 4);
        uStack_2f68 = *(undefined8 *)(local_3c90 + 6);
        local_3a98 = local_3c90 + 8;
        local_2fe0 = *(undefined8 *)local_3a98;
        uStack_2fd8 = *(undefined8 *)(local_3c90 + 10);
        uStack_2fd0 = *(undefined8 *)(local_3c90 + 0xc);
        uStack_2fc8 = *(undefined8 *)(local_3c90 + 0xe);
        local_3aa0 = local_3c90 + 0x10;
        local_32e0 = *(undefined8 *)local_3aa0;
        uStack_32d8 = *(undefined8 *)(local_3c90 + 0x12);
        uStack_32d0 = *(undefined8 *)(local_3c90 + 0x14);
        uStack_32c8 = *(undefined8 *)(local_3c90 + 0x16);
        local_3aa8 = local_3c98;
        local_30a0 = *(undefined8 *)local_3c98;
        uStack_3098 = *(undefined8 *)(local_3c98 + 2);
        uStack_3090 = *(undefined8 *)(local_3c98 + 4);
        uStack_3088 = *(undefined8 *)(local_3c98 + 6);
        local_3ab0 = local_3c98 + 8;
        local_3100 = *(undefined8 *)local_3ab0;
        uStack_30f8 = *(undefined8 *)(local_3c98 + 10);
        uStack_30f0 = *(undefined8 *)(local_3c98 + 0xc);
        uStack_30e8 = *(undefined8 *)(local_3c98 + 0xe);
        local_3ab8 = local_3c98 + 0x10;
        local_3400 = *(undefined8 *)local_3ab8;
        uStack_33f8 = *(undefined8 *)(local_3c98 + 0x12);
        uStack_33f0 = *(undefined8 *)(local_3c98 + 0x14);
        uStack_33e8 = *(undefined8 *)(local_3c98 + 0x16);
        local_3ac0 = local_3ca0;
        local_31c0 = *(undefined8 *)local_3ca0;
        uStack_31b8 = *(undefined8 *)(local_3ca0 + 2);
        uStack_31b0 = *(undefined8 *)(local_3ca0 + 4);
        uStack_31a8 = *(undefined8 *)(local_3ca0 + 6);
        local_3ac8 = local_3ca0 + 8;
        local_3220 = *(undefined8 *)local_3ac8;
        uStack_3218 = *(undefined8 *)(local_3ca0 + 10);
        uStack_3210 = *(undefined8 *)(local_3ca0 + 0xc);
        uStack_3208 = *(undefined8 *)(local_3ca0 + 0xe);
        local_3ad0 = local_3ca0 + 0x10;
        local_3520 = *(undefined8 *)local_3ad0;
        uStack_3518 = *(undefined8 *)(local_3ca0 + 0x12);
        uStack_3510 = *(undefined8 *)(local_3ca0 + 0x14);
        uStack_3508 = *(undefined8 *)(local_3ca0 + 0x16);
        local_2fa0 = local_3c20;
        uStack_2f98 = uStack_3c18;
        uStack_2f90 = uStack_3c10;
        uStack_2f88 = uStack_3c08;
        local_6e0 = (float)local_21e0;
        fStack_6dc = local_21e0._4_4_;
        fStack_6d8 = (float)uStack_21d8;
        fStack_6d4 = uStack_21d8._4_4_;
        fStack_6d0 = (float)uStack_21d0;
        fStack_6cc = uStack_21d0._4_4_;
        fStack_6c8 = (float)uStack_21c8;
        fStack_1684 = uStack_21c8._4_4_;
        local_700._0_4_ = (float)local_2f80;
        local_700._4_4_ = (float)((ulong)local_2f80 >> 0x20);
        uStack_6f8._0_4_ = (float)uStack_2f78;
        uStack_6f8._4_4_ = (float)((ulong)uStack_2f78 >> 0x20);
        uStack_6f0._0_4_ = (float)uStack_2f70;
        uStack_6f0._4_4_ = (float)((ulong)uStack_2f70 >> 0x20);
        uStack_6e8._0_4_ = (float)uStack_2f68;
        local_16a0 = (float)local_21e0 * (float)local_700;
        fStack_169c = local_21e0._4_4_ * local_700._4_4_;
        fStack_1698 = (float)uStack_21d8 * (float)uStack_6f8;
        fStack_1694 = uStack_21d8._4_4_ * uStack_6f8._4_4_;
        fStack_1690 = (float)uStack_21d0 * (float)uStack_6f0;
        fStack_168c = uStack_21d0._4_4_ * uStack_6f0._4_4_;
        fStack_1688 = (float)uStack_21c8 * (float)uStack_6e8;
        local_16c0 = local_3c20;
        uStack_16b8 = uStack_3c18;
        uStack_16b0 = uStack_3c10;
        uStack_16a8 = uStack_3c08;
        local_3000 = CONCAT44(fStack_169c + local_1fc0._4_4_,local_16a0 + (float)local_1fc0);
        uStack_2ff8 = CONCAT44(fStack_1694 + uStack_1fb8._4_4_,fStack_1698 + (float)uStack_1fb8);
        uStack_2ff0 = CONCAT44(fStack_168c + uStack_1fb0._4_4_,fStack_1690 + (float)uStack_1fb0);
        uStack_2fe8 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1688 + (float)uStack_1fa8);
        local_6a0 = (float)local_2240;
        fStack_69c = local_2240._4_4_;
        fStack_698 = (float)uStack_2238;
        fStack_694 = uStack_2238._4_4_;
        fStack_690 = (float)uStack_2230;
        fStack_68c = uStack_2230._4_4_;
        fStack_688 = (float)uStack_2228;
        fStack_1644 = uStack_2228._4_4_;
        local_6c0._0_4_ = (float)local_2fe0;
        local_6c0._4_4_ = (float)((ulong)local_2fe0 >> 0x20);
        uStack_6b8._0_4_ = (float)uStack_2fd8;
        uStack_6b8._4_4_ = (float)((ulong)uStack_2fd8 >> 0x20);
        uStack_6b0._0_4_ = (float)uStack_2fd0;
        uStack_6b0._4_4_ = (float)((ulong)uStack_2fd0 >> 0x20);
        uStack_6a8._0_4_ = (float)uStack_2fc8;
        local_1660 = (float)local_2240 * (float)local_6c0;
        fStack_165c = local_2240._4_4_ * local_6c0._4_4_;
        fStack_1658 = (float)uStack_2238 * (float)uStack_6b8;
        fStack_1654 = uStack_2238._4_4_ * uStack_6b8._4_4_;
        fStack_1650 = (float)uStack_2230 * (float)uStack_6b0;
        fStack_164c = uStack_2230._4_4_ * uStack_6b0._4_4_;
        fStack_1648 = (float)uStack_2228 * (float)uStack_6a8;
        fVar79 = local_1660 + local_16a0 + (float)local_1fc0;
        fVar81 = fStack_165c + fStack_169c + local_1fc0._4_4_;
        fVar82 = fStack_1658 + fStack_1698 + (float)uStack_1fb8;
        fVar83 = fStack_1654 + fStack_1694 + uStack_1fb8._4_4_;
        fVar84 = fStack_1650 + fStack_1690 + (float)uStack_1fb0;
        fVar85 = fStack_164c + fStack_168c + uStack_1fb0._4_4_;
        fVar86 = fStack_1648 + fStack_1688 + (float)uStack_1fa8;
        fVar87 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_3060 = CONCAT44(fVar81,fVar79);
        uStack_3058 = CONCAT44(fVar83,fVar82);
        uStack_3050 = CONCAT44(fVar85,fVar84);
        uStack_3048 = CONCAT44(fVar87,fVar86);
        local_660 = (float)local_22a0;
        fStack_65c = local_22a0._4_4_;
        fStack_658 = (float)uStack_2298;
        fStack_654 = uStack_2298._4_4_;
        fStack_650 = (float)uStack_2290;
        fStack_64c = uStack_2290._4_4_;
        fStack_648 = (float)uStack_2288;
        fStack_1604 = uStack_2288._4_4_;
        local_680._0_4_ = (float)local_32e0;
        local_680._4_4_ = (float)((ulong)local_32e0 >> 0x20);
        uStack_678._0_4_ = (float)uStack_32d8;
        uStack_678._4_4_ = (float)((ulong)uStack_32d8 >> 0x20);
        uStack_670._0_4_ = (float)uStack_32d0;
        uStack_670._4_4_ = (float)((ulong)uStack_32d0 >> 0x20);
        uStack_668._0_4_ = (float)uStack_32c8;
        local_1620 = (float)local_22a0 * (float)local_680;
        fStack_161c = local_22a0._4_4_ * local_680._4_4_;
        fStack_1618 = (float)uStack_2298 * (float)uStack_678;
        fStack_1614 = uStack_2298._4_4_ * uStack_678._4_4_;
        fStack_1610 = (float)uStack_2290 * (float)uStack_670;
        fStack_160c = uStack_2290._4_4_ * uStack_670._4_4_;
        fStack_1608 = (float)uStack_2288 * (float)uStack_668;
        fVar79 = local_1620 + fVar79;
        fVar81 = fStack_161c + fVar81;
        fVar82 = fStack_1618 + fVar82;
        fVar83 = fStack_1614 + fVar83;
        fVar84 = fStack_1610 + fVar84;
        fVar85 = fStack_160c + fVar85;
        fVar86 = fStack_1608 + fVar86;
        fVar87 = uStack_2288._4_4_ + fVar87;
        local_30c0 = CONCAT44(fVar81,fVar79);
        uStack_30b8 = CONCAT44(fVar83,fVar82);
        uStack_30b0 = CONCAT44(fVar85,fVar84);
        uStack_30a8 = CONCAT44(fVar87,fVar86);
        local_620 = (float)local_2300;
        fStack_61c = local_2300._4_4_;
        fStack_618 = (float)uStack_22f8;
        fStack_614 = uStack_22f8._4_4_;
        fStack_610 = (float)uStack_22f0;
        fStack_60c = uStack_22f0._4_4_;
        fStack_608 = (float)uStack_22e8;
        fStack_15c4 = uStack_22e8._4_4_;
        local_640._0_4_ = (float)local_30a0;
        local_640._4_4_ = (float)((ulong)local_30a0 >> 0x20);
        uStack_638._0_4_ = (float)uStack_3098;
        uStack_638._4_4_ = (float)((ulong)uStack_3098 >> 0x20);
        uStack_630._0_4_ = (float)uStack_3090;
        uStack_630._4_4_ = (float)((ulong)uStack_3090 >> 0x20);
        uStack_628._0_4_ = (float)uStack_3088;
        local_15e0 = (float)local_2300 * (float)local_640;
        fStack_15dc = local_2300._4_4_ * local_640._4_4_;
        fStack_15d8 = (float)uStack_22f8 * (float)uStack_638;
        fStack_15d4 = uStack_22f8._4_4_ * uStack_638._4_4_;
        fStack_15d0 = (float)uStack_22f0 * (float)uStack_630;
        fStack_15cc = uStack_22f0._4_4_ * uStack_630._4_4_;
        fStack_15c8 = (float)uStack_22e8 * (float)uStack_628;
        fVar79 = local_15e0 + fVar79;
        fVar81 = fStack_15dc + fVar81;
        fVar82 = fStack_15d8 + fVar82;
        fVar83 = fStack_15d4 + fVar83;
        fVar84 = fStack_15d0 + fVar84;
        fVar85 = fStack_15cc + fVar85;
        fVar86 = fStack_15c8 + fVar86;
        fVar87 = uStack_22e8._4_4_ + fVar87;
        local_3120 = CONCAT44(fVar81,fVar79);
        uStack_3118 = CONCAT44(fVar83,fVar82);
        uStack_3110 = CONCAT44(fVar85,fVar84);
        uStack_3108 = CONCAT44(fVar87,fVar86);
        local_5e0 = (float)local_2360;
        fStack_5dc = local_2360._4_4_;
        fStack_5d8 = (float)uStack_2358;
        fStack_5d4 = uStack_2358._4_4_;
        fStack_5d0 = (float)uStack_2350;
        fStack_5cc = uStack_2350._4_4_;
        fStack_5c8 = (float)uStack_2348;
        fStack_1584 = uStack_2348._4_4_;
        local_600._0_4_ = (float)local_3100;
        local_600._4_4_ = (float)((ulong)local_3100 >> 0x20);
        uStack_5f8._0_4_ = (float)uStack_30f8;
        uStack_5f8._4_4_ = (float)((ulong)uStack_30f8 >> 0x20);
        uStack_5f0._0_4_ = (float)uStack_30f0;
        uStack_5f0._4_4_ = (float)((ulong)uStack_30f0 >> 0x20);
        uStack_5e8._0_4_ = (float)uStack_30e8;
        local_15a0 = (float)local_2360 * (float)local_600;
        fStack_159c = local_2360._4_4_ * local_600._4_4_;
        fStack_1598 = (float)uStack_2358 * (float)uStack_5f8;
        fStack_1594 = uStack_2358._4_4_ * uStack_5f8._4_4_;
        fStack_1590 = (float)uStack_2350 * (float)uStack_5f0;
        fStack_158c = uStack_2350._4_4_ * uStack_5f0._4_4_;
        fStack_1588 = (float)uStack_2348 * (float)uStack_5e8;
        fVar79 = local_15a0 + fVar79;
        fVar81 = fStack_159c + fVar81;
        fVar82 = fStack_1598 + fVar82;
        fVar83 = fStack_1594 + fVar83;
        fVar84 = fStack_1590 + fVar84;
        fVar85 = fStack_158c + fVar85;
        fVar86 = fStack_1588 + fVar86;
        fVar87 = uStack_2348._4_4_ + fVar87;
        local_3180 = CONCAT44(fVar81,fVar79);
        uStack_3178 = CONCAT44(fVar83,fVar82);
        uStack_3170 = CONCAT44(fVar85,fVar84);
        uStack_3168 = CONCAT44(fVar87,fVar86);
        local_5a0 = (float)local_23c0;
        fStack_59c = local_23c0._4_4_;
        fStack_598 = (float)uStack_23b8;
        fStack_594 = uStack_23b8._4_4_;
        fStack_590 = (float)uStack_23b0;
        fStack_58c = uStack_23b0._4_4_;
        fStack_588 = (float)uStack_23a8;
        fStack_1544 = uStack_23a8._4_4_;
        local_5c0._0_4_ = (float)local_3400;
        local_5c0._4_4_ = (float)((ulong)local_3400 >> 0x20);
        uStack_5b8._0_4_ = (float)uStack_33f8;
        uStack_5b8._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
        uStack_5b0._0_4_ = (float)uStack_33f0;
        uStack_5b0._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
        uStack_5a8._0_4_ = (float)uStack_33e8;
        local_1560 = (float)local_23c0 * (float)local_5c0;
        fStack_155c = local_23c0._4_4_ * local_5c0._4_4_;
        fStack_1558 = (float)uStack_23b8 * (float)uStack_5b8;
        fStack_1554 = uStack_23b8._4_4_ * uStack_5b8._4_4_;
        fStack_1550 = (float)uStack_23b0 * (float)uStack_5b0;
        fStack_154c = uStack_23b0._4_4_ * uStack_5b0._4_4_;
        fStack_1548 = (float)uStack_23a8 * (float)uStack_5a8;
        fVar79 = local_1560 + fVar79;
        fVar81 = fStack_155c + fVar81;
        fVar82 = fStack_1558 + fVar82;
        fVar83 = fStack_1554 + fVar83;
        fVar84 = fStack_1550 + fVar84;
        fVar85 = fStack_154c + fVar85;
        fVar86 = fStack_1548 + fVar86;
        fVar87 = uStack_23a8._4_4_ + fVar87;
        local_31e0 = CONCAT44(fVar81,fVar79);
        uStack_31d8 = CONCAT44(fVar83,fVar82);
        uStack_31d0 = CONCAT44(fVar85,fVar84);
        uStack_31c8 = CONCAT44(fVar87,fVar86);
        local_560 = (float)local_2420;
        fStack_55c = local_2420._4_4_;
        fStack_558 = (float)uStack_2418;
        fStack_554 = uStack_2418._4_4_;
        fStack_550 = (float)uStack_2410;
        fStack_54c = uStack_2410._4_4_;
        fStack_548 = (float)uStack_2408;
        fStack_1504 = uStack_2408._4_4_;
        local_580._0_4_ = (float)local_31c0;
        local_580._4_4_ = (float)((ulong)local_31c0 >> 0x20);
        uStack_578._0_4_ = (float)uStack_31b8;
        uStack_578._4_4_ = (float)((ulong)uStack_31b8 >> 0x20);
        uStack_570._0_4_ = (float)uStack_31b0;
        uStack_570._4_4_ = (float)((ulong)uStack_31b0 >> 0x20);
        uStack_568._0_4_ = (float)uStack_31a8;
        local_1520 = (float)local_2420 * (float)local_580;
        fStack_151c = local_2420._4_4_ * local_580._4_4_;
        fStack_1518 = (float)uStack_2418 * (float)uStack_578;
        fStack_1514 = uStack_2418._4_4_ * uStack_578._4_4_;
        fStack_1510 = (float)uStack_2410 * (float)uStack_570;
        fStack_150c = uStack_2410._4_4_ * uStack_570._4_4_;
        fStack_1508 = (float)uStack_2408 * (float)uStack_568;
        fVar79 = local_1520 + fVar79;
        fVar81 = fStack_151c + fVar81;
        fVar82 = fStack_1518 + fVar82;
        fVar83 = fStack_1514 + fVar83;
        fVar84 = fStack_1510 + fVar84;
        fVar85 = fStack_150c + fVar85;
        fVar86 = fStack_1508 + fVar86;
        fVar87 = uStack_2408._4_4_ + fVar87;
        local_3240 = CONCAT44(fVar81,fVar79);
        uStack_3238 = CONCAT44(fVar83,fVar82);
        uStack_3230 = CONCAT44(fVar85,fVar84);
        uStack_3228 = CONCAT44(fVar87,fVar86);
        local_520 = (float)local_2480;
        fStack_51c = local_2480._4_4_;
        fStack_518 = (float)uStack_2478;
        fStack_514 = uStack_2478._4_4_;
        fStack_510 = (float)uStack_2470;
        fStack_50c = uStack_2470._4_4_;
        fStack_508 = (float)uStack_2468;
        fStack_14c4 = uStack_2468._4_4_;
        local_540._0_4_ = (float)local_3220;
        local_540._4_4_ = (float)((ulong)local_3220 >> 0x20);
        uStack_538._0_4_ = (float)uStack_3218;
        uStack_538._4_4_ = (float)((ulong)uStack_3218 >> 0x20);
        uStack_530._0_4_ = (float)uStack_3210;
        uStack_530._4_4_ = (float)((ulong)uStack_3210 >> 0x20);
        uStack_528._0_4_ = (float)uStack_3208;
        local_14e0 = (float)local_2480 * (float)local_540;
        fStack_14dc = local_2480._4_4_ * local_540._4_4_;
        fStack_14d8 = (float)uStack_2478 * (float)uStack_538;
        fStack_14d4 = uStack_2478._4_4_ * uStack_538._4_4_;
        fStack_14d0 = (float)uStack_2470 * (float)uStack_530;
        fStack_14cc = uStack_2470._4_4_ * uStack_530._4_4_;
        fStack_14c8 = (float)uStack_2468 * (float)uStack_528;
        fVar79 = local_14e0 + fVar79;
        fVar81 = fStack_14dc + fVar81;
        fVar82 = fStack_14d8 + fVar82;
        fVar83 = fStack_14d4 + fVar83;
        fVar84 = fStack_14d0 + fVar84;
        fVar85 = fStack_14cc + fVar85;
        fVar86 = fStack_14c8 + fVar86;
        fVar87 = uStack_2468._4_4_ + fVar87;
        local_32a0 = CONCAT44(fVar81,fVar79);
        uStack_3298 = CONCAT44(fVar83,fVar82);
        uStack_3290 = CONCAT44(fVar85,fVar84);
        uStack_3288 = CONCAT44(fVar87,fVar86);
        local_4e0 = (float)local_24e0;
        fStack_4dc = local_24e0._4_4_;
        fStack_4d8 = (float)uStack_24d8;
        fStack_4d4 = uStack_24d8._4_4_;
        fStack_4d0 = (float)uStack_24d0;
        fStack_4cc = uStack_24d0._4_4_;
        fStack_4c8 = (float)uStack_24c8;
        fStack_1484 = uStack_24c8._4_4_;
        local_500._0_4_ = (float)local_3520;
        local_500._4_4_ = (float)((ulong)local_3520 >> 0x20);
        uStack_4f8._0_4_ = (float)uStack_3518;
        uStack_4f8._4_4_ = (float)((ulong)uStack_3518 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_3510;
        uStack_4f0._4_4_ = (float)((ulong)uStack_3510 >> 0x20);
        uStack_4e8._0_4_ = (float)uStack_3508;
        local_14a0 = (float)local_24e0 * (float)local_500;
        fStack_149c = local_24e0._4_4_ * local_500._4_4_;
        fStack_1498 = (float)uStack_24d8 * (float)uStack_4f8;
        fStack_1494 = uStack_24d8._4_4_ * uStack_4f8._4_4_;
        fStack_1490 = (float)uStack_24d0 * (float)uStack_4f0;
        fStack_148c = uStack_24d0._4_4_ * uStack_4f0._4_4_;
        fStack_1488 = (float)uStack_24c8 * (float)uStack_4e8;
        local_2140 = CONCAT44(fStack_149c + fVar81,local_14a0 + fVar79);
        uStack_2138 = CONCAT44(fStack_1494 + fVar83,fStack_1498 + fVar82);
        uStack_2130 = CONCAT44(fStack_148c + fVar85,fStack_1490 + fVar84);
        uStack_2128 = CONCAT44(uStack_24c8._4_4_ + fVar87,fStack_1488 + fVar86);
        local_3ad8 = local_3c90 + 0x18;
        local_3340 = *(undefined8 *)local_3ad8;
        uStack_3338 = *(undefined8 *)(local_3c90 + 0x1a);
        uStack_3330 = *(undefined8 *)(local_3c90 + 0x1c);
        uStack_3328 = *(undefined8 *)(local_3c90 + 0x1e);
        local_3ae0 = local_3c98 + 0x18;
        local_3460 = *(undefined8 *)local_3ae0;
        uStack_3458 = *(undefined8 *)(local_3c98 + 0x1a);
        uStack_3450 = *(undefined8 *)(local_3c98 + 0x1c);
        uStack_3448 = *(undefined8 *)(local_3c98 + 0x1e);
        local_3ae8 = local_3ca0 + 0x18;
        local_3580 = *(undefined8 *)local_3ae8;
        uStack_3578 = *(undefined8 *)(local_3ca0 + 0x1a);
        uStack_3570 = *(undefined8 *)(local_3ca0 + 0x1c);
        uStack_3568 = *(undefined8 *)(local_3ca0 + 0x1e);
        local_3af0 = local_3c90 + 0x20;
        local_33a0 = *(undefined8 *)local_3af0;
        uStack_3398 = *(undefined8 *)(local_3c90 + 0x22);
        uStack_3390 = *(undefined8 *)(local_3c90 + 0x24);
        uStack_3388 = *(undefined8 *)(local_3c90 + 0x26);
        local_3af8 = local_3c98 + 0x20;
        local_34c0 = *(undefined8 *)local_3af8;
        uStack_34b8 = *(undefined8 *)(local_3c98 + 0x22);
        uStack_34b0 = *(undefined8 *)(local_3c98 + 0x24);
        uStack_34a8 = *(undefined8 *)(local_3c98 + 0x26);
        local_3b00 = local_3ca0 + 0x20;
        local_35e0 = *(undefined8 *)local_3b00;
        uStack_35d8 = *(undefined8 *)(local_3ca0 + 0x22);
        uStack_35d0 = *(undefined8 *)(local_3ca0 + 0x24);
        uStack_35c8 = *(undefined8 *)(local_3ca0 + 0x26);
        local_2108 = local_3c40;
        *(undefined8 *)local_3c40 = local_2140;
        *(undefined8 *)(local_3c40 + 2) = uStack_2138;
        *(undefined8 *)(local_3c40 + 4) = uStack_2130;
        *(undefined8 *)(local_3c40 + 6) = uStack_2128;
        local_3300 = local_3c20;
        uStack_32f8 = uStack_3c18;
        uStack_32f0 = uStack_3c10;
        uStack_32e8 = uStack_3c08;
        local_4a0 = (float)local_21e0;
        fStack_49c = local_21e0._4_4_;
        fStack_498 = (float)uStack_21d8;
        fStack_494 = uStack_21d8._4_4_;
        fStack_490 = (float)uStack_21d0;
        fStack_48c = uStack_21d0._4_4_;
        fStack_488 = (float)uStack_21c8;
        fStack_1444 = uStack_21c8._4_4_;
        local_1460 = (float)local_21e0 * (float)local_680;
        fStack_145c = local_21e0._4_4_ * local_680._4_4_;
        fStack_1458 = (float)uStack_21d8 * (float)uStack_678;
        fStack_1454 = uStack_21d8._4_4_ * uStack_678._4_4_;
        fStack_1450 = (float)uStack_21d0 * (float)uStack_670;
        fStack_144c = uStack_21d0._4_4_ * uStack_670._4_4_;
        fStack_1448 = (float)uStack_21c8 * (float)uStack_668;
        local_1480 = local_3c20;
        uStack_1478 = uStack_3c18;
        uStack_1470 = uStack_3c10;
        uStack_1468 = uStack_3c08;
        local_3360 = CONCAT44(fStack_145c + local_1fc0._4_4_,local_1460 + (float)local_1fc0);
        uStack_3358 = CONCAT44(fStack_1454 + uStack_1fb8._4_4_,fStack_1458 + (float)uStack_1fb8);
        uStack_3350 = CONCAT44(fStack_144c + uStack_1fb0._4_4_,fStack_1450 + (float)uStack_1fb0);
        uStack_3348 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1448 + (float)uStack_1fa8);
        local_460 = (float)local_2240;
        fStack_45c = local_2240._4_4_;
        fStack_458 = (float)uStack_2238;
        fStack_454 = uStack_2238._4_4_;
        fStack_450 = (float)uStack_2230;
        fStack_44c = uStack_2230._4_4_;
        fStack_448 = (float)uStack_2228;
        fStack_1404 = uStack_2228._4_4_;
        local_480._0_4_ = (float)local_3340;
        local_480._4_4_ = (float)((ulong)local_3340 >> 0x20);
        uStack_478._0_4_ = (float)uStack_3338;
        uStack_478._4_4_ = (float)((ulong)uStack_3338 >> 0x20);
        uStack_470._0_4_ = (float)uStack_3330;
        uStack_470._4_4_ = (float)((ulong)uStack_3330 >> 0x20);
        uStack_468._0_4_ = (float)uStack_3328;
        local_1420 = (float)local_2240 * (float)local_480;
        fStack_141c = local_2240._4_4_ * local_480._4_4_;
        fStack_1418 = (float)uStack_2238 * (float)uStack_478;
        fStack_1414 = uStack_2238._4_4_ * uStack_478._4_4_;
        fStack_1410 = (float)uStack_2230 * (float)uStack_470;
        fStack_140c = uStack_2230._4_4_ * uStack_470._4_4_;
        fStack_1408 = (float)uStack_2228 * (float)uStack_468;
        fVar79 = local_1420 + local_1460 + (float)local_1fc0;
        fVar81 = fStack_141c + fStack_145c + local_1fc0._4_4_;
        fVar82 = fStack_1418 + fStack_1458 + (float)uStack_1fb8;
        fVar83 = fStack_1414 + fStack_1454 + uStack_1fb8._4_4_;
        fVar84 = fStack_1410 + fStack_1450 + (float)uStack_1fb0;
        fVar85 = fStack_140c + fStack_144c + uStack_1fb0._4_4_;
        fVar86 = fStack_1408 + fStack_1448 + (float)uStack_1fa8;
        fVar87 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_33c0 = CONCAT44(fVar81,fVar79);
        uStack_33b8 = CONCAT44(fVar83,fVar82);
        uStack_33b0 = CONCAT44(fVar85,fVar84);
        uStack_33a8 = CONCAT44(fVar87,fVar86);
        local_420 = (float)local_22a0;
        fStack_41c = local_22a0._4_4_;
        fStack_418 = (float)uStack_2298;
        fStack_414 = uStack_2298._4_4_;
        fStack_410 = (float)uStack_2290;
        fStack_40c = uStack_2290._4_4_;
        fStack_408 = (float)uStack_2288;
        fStack_13c4 = uStack_2288._4_4_;
        local_440._0_4_ = (float)local_33a0;
        local_440._4_4_ = (float)((ulong)local_33a0 >> 0x20);
        uStack_438._0_4_ = (float)uStack_3398;
        uStack_438._4_4_ = (float)((ulong)uStack_3398 >> 0x20);
        uStack_430._0_4_ = (float)uStack_3390;
        uStack_430._4_4_ = (float)((ulong)uStack_3390 >> 0x20);
        uStack_428._0_4_ = (float)uStack_3388;
        local_13e0 = (float)local_22a0 * (float)local_440;
        fStack_13dc = local_22a0._4_4_ * local_440._4_4_;
        fStack_13d8 = (float)uStack_2298 * (float)uStack_438;
        fStack_13d4 = uStack_2298._4_4_ * uStack_438._4_4_;
        fStack_13d0 = (float)uStack_2290 * (float)uStack_430;
        fStack_13cc = uStack_2290._4_4_ * uStack_430._4_4_;
        fStack_13c8 = (float)uStack_2288 * (float)uStack_428;
        fVar79 = local_13e0 + fVar79;
        fVar81 = fStack_13dc + fVar81;
        fVar82 = fStack_13d8 + fVar82;
        fVar83 = fStack_13d4 + fVar83;
        fVar84 = fStack_13d0 + fVar84;
        fVar85 = fStack_13cc + fVar85;
        fVar86 = fStack_13c8 + fVar86;
        fVar87 = uStack_2288._4_4_ + fVar87;
        local_3420 = CONCAT44(fVar81,fVar79);
        uStack_3418 = CONCAT44(fVar83,fVar82);
        uStack_3410 = CONCAT44(fVar85,fVar84);
        uStack_3408 = CONCAT44(fVar87,fVar86);
        local_3e0 = (float)local_2300;
        fStack_3dc = local_2300._4_4_;
        fStack_3d8 = (float)uStack_22f8;
        fStack_3d4 = uStack_22f8._4_4_;
        fStack_3d0 = (float)uStack_22f0;
        fStack_3cc = uStack_22f0._4_4_;
        fStack_3c8 = (float)uStack_22e8;
        fStack_1384 = uStack_22e8._4_4_;
        local_13a0 = (float)local_2300 * (float)local_5c0;
        fStack_139c = local_2300._4_4_ * local_5c0._4_4_;
        fStack_1398 = (float)uStack_22f8 * (float)uStack_5b8;
        fStack_1394 = uStack_22f8._4_4_ * uStack_5b8._4_4_;
        fStack_1390 = (float)uStack_22f0 * (float)uStack_5b0;
        fStack_138c = uStack_22f0._4_4_ * uStack_5b0._4_4_;
        fStack_1388 = (float)uStack_22e8 * (float)uStack_5a8;
        fVar79 = local_13a0 + fVar79;
        fVar81 = fStack_139c + fVar81;
        fVar82 = fStack_1398 + fVar82;
        fVar83 = fStack_1394 + fVar83;
        fVar84 = fStack_1390 + fVar84;
        fVar85 = fStack_138c + fVar85;
        fVar86 = fStack_1388 + fVar86;
        fVar87 = uStack_22e8._4_4_ + fVar87;
        local_3480 = CONCAT44(fVar81,fVar79);
        uStack_3478 = CONCAT44(fVar83,fVar82);
        uStack_3470 = CONCAT44(fVar85,fVar84);
        uStack_3468 = CONCAT44(fVar87,fVar86);
        local_3a0 = (float)local_2360;
        fStack_39c = local_2360._4_4_;
        fStack_398 = (float)uStack_2358;
        fStack_394 = uStack_2358._4_4_;
        fStack_390 = (float)uStack_2350;
        fStack_38c = uStack_2350._4_4_;
        fStack_388 = (float)uStack_2348;
        fStack_1344 = uStack_2348._4_4_;
        local_3c0._0_4_ = (float)local_3460;
        local_3c0._4_4_ = (float)((ulong)local_3460 >> 0x20);
        uStack_3b8._0_4_ = (float)uStack_3458;
        uStack_3b8._4_4_ = (float)((ulong)uStack_3458 >> 0x20);
        uStack_3b0._0_4_ = (float)uStack_3450;
        uStack_3b0._4_4_ = (float)((ulong)uStack_3450 >> 0x20);
        uStack_3a8._0_4_ = (float)uStack_3448;
        local_1360 = (float)local_2360 * (float)local_3c0;
        fStack_135c = local_2360._4_4_ * local_3c0._4_4_;
        fStack_1358 = (float)uStack_2358 * (float)uStack_3b8;
        fStack_1354 = uStack_2358._4_4_ * uStack_3b8._4_4_;
        fStack_1350 = (float)uStack_2350 * (float)uStack_3b0;
        fStack_134c = uStack_2350._4_4_ * uStack_3b0._4_4_;
        fStack_1348 = (float)uStack_2348 * (float)uStack_3a8;
        fVar79 = local_1360 + fVar79;
        fVar81 = fStack_135c + fVar81;
        fVar82 = fStack_1358 + fVar82;
        fVar83 = fStack_1354 + fVar83;
        fVar84 = fStack_1350 + fVar84;
        fVar85 = fStack_134c + fVar85;
        fVar86 = fStack_1348 + fVar86;
        fVar87 = uStack_2348._4_4_ + fVar87;
        local_34e0 = CONCAT44(fVar81,fVar79);
        uStack_34d8 = CONCAT44(fVar83,fVar82);
        uStack_34d0 = CONCAT44(fVar85,fVar84);
        uStack_34c8 = CONCAT44(fVar87,fVar86);
        local_360 = (float)local_23c0;
        fStack_35c = local_23c0._4_4_;
        fStack_358 = (float)uStack_23b8;
        fStack_354 = uStack_23b8._4_4_;
        fStack_350 = (float)uStack_23b0;
        fStack_34c = uStack_23b0._4_4_;
        fStack_348 = (float)uStack_23a8;
        fStack_1304 = uStack_23a8._4_4_;
        local_380._0_4_ = (float)local_34c0;
        local_380._4_4_ = (float)((ulong)local_34c0 >> 0x20);
        uStack_378._0_4_ = (float)uStack_34b8;
        uStack_378._4_4_ = (float)((ulong)uStack_34b8 >> 0x20);
        uStack_370._0_4_ = (float)uStack_34b0;
        uStack_370._4_4_ = (float)((ulong)uStack_34b0 >> 0x20);
        uStack_368._0_4_ = (float)uStack_34a8;
        local_1320 = (float)local_23c0 * (float)local_380;
        fStack_131c = local_23c0._4_4_ * local_380._4_4_;
        fStack_1318 = (float)uStack_23b8 * (float)uStack_378;
        fStack_1314 = uStack_23b8._4_4_ * uStack_378._4_4_;
        fStack_1310 = (float)uStack_23b0 * (float)uStack_370;
        fStack_130c = uStack_23b0._4_4_ * uStack_370._4_4_;
        fStack_1308 = (float)uStack_23a8 * (float)uStack_368;
        fVar79 = local_1320 + fVar79;
        fVar81 = fStack_131c + fVar81;
        fVar82 = fStack_1318 + fVar82;
        fVar83 = fStack_1314 + fVar83;
        fVar84 = fStack_1310 + fVar84;
        fVar85 = fStack_130c + fVar85;
        fVar86 = fStack_1308 + fVar86;
        fVar87 = uStack_23a8._4_4_ + fVar87;
        local_3540 = CONCAT44(fVar81,fVar79);
        uStack_3538 = CONCAT44(fVar83,fVar82);
        uStack_3530 = CONCAT44(fVar85,fVar84);
        uStack_3528 = CONCAT44(fVar87,fVar86);
        local_320 = (float)local_2420;
        fStack_31c = local_2420._4_4_;
        fStack_318 = (float)uStack_2418;
        fStack_314 = uStack_2418._4_4_;
        fStack_310 = (float)uStack_2410;
        fStack_30c = uStack_2410._4_4_;
        fStack_308 = (float)uStack_2408;
        fStack_12c4 = uStack_2408._4_4_;
        local_12e0 = (float)local_2420 * (float)local_500;
        fStack_12dc = local_2420._4_4_ * local_500._4_4_;
        fStack_12d8 = (float)uStack_2418 * (float)uStack_4f8;
        fStack_12d4 = uStack_2418._4_4_ * uStack_4f8._4_4_;
        fStack_12d0 = (float)uStack_2410 * (float)uStack_4f0;
        fStack_12cc = uStack_2410._4_4_ * uStack_4f0._4_4_;
        fStack_12c8 = (float)uStack_2408 * (float)uStack_4e8;
        fVar79 = local_12e0 + fVar79;
        fVar81 = fStack_12dc + fVar81;
        fVar82 = fStack_12d8 + fVar82;
        fVar83 = fStack_12d4 + fVar83;
        fVar84 = fStack_12d0 + fVar84;
        fVar85 = fStack_12cc + fVar85;
        fVar86 = fStack_12c8 + fVar86;
        fVar87 = uStack_2408._4_4_ + fVar87;
        local_35a0 = CONCAT44(fVar81,fVar79);
        uStack_3598 = CONCAT44(fVar83,fVar82);
        uStack_3590 = CONCAT44(fVar85,fVar84);
        uStack_3588 = CONCAT44(fVar87,fVar86);
        local_2e0 = (float)local_2480;
        fStack_2dc = local_2480._4_4_;
        fStack_2d8 = (float)uStack_2478;
        fStack_2d4 = uStack_2478._4_4_;
        fStack_2d0 = (float)uStack_2470;
        fStack_2cc = uStack_2470._4_4_;
        fStack_2c8 = (float)uStack_2468;
        fStack_1284 = uStack_2468._4_4_;
        local_300._0_4_ = (float)local_3580;
        local_300._4_4_ = (float)((ulong)local_3580 >> 0x20);
        uStack_2f8._0_4_ = (float)uStack_3578;
        uStack_2f8._4_4_ = (float)((ulong)uStack_3578 >> 0x20);
        uStack_2f0._0_4_ = (float)uStack_3570;
        uStack_2f0._4_4_ = (float)((ulong)uStack_3570 >> 0x20);
        uStack_2e8._0_4_ = (float)uStack_3568;
        local_12a0 = (float)local_2480 * (float)local_300;
        fStack_129c = local_2480._4_4_ * local_300._4_4_;
        fStack_1298 = (float)uStack_2478 * (float)uStack_2f8;
        fStack_1294 = uStack_2478._4_4_ * uStack_2f8._4_4_;
        fStack_1290 = (float)uStack_2470 * (float)uStack_2f0;
        fStack_128c = uStack_2470._4_4_ * uStack_2f0._4_4_;
        fStack_1288 = (float)uStack_2468 * (float)uStack_2e8;
        fVar79 = local_12a0 + fVar79;
        fVar81 = fStack_129c + fVar81;
        fVar82 = fStack_1298 + fVar82;
        fVar83 = fStack_1294 + fVar83;
        fVar84 = fStack_1290 + fVar84;
        fVar85 = fStack_128c + fVar85;
        fVar86 = fStack_1288 + fVar86;
        fVar87 = uStack_2468._4_4_ + fVar87;
        local_3600 = CONCAT44(fVar81,fVar79);
        uStack_35f8 = CONCAT44(fVar83,fVar82);
        uStack_35f0 = CONCAT44(fVar85,fVar84);
        uStack_35e8 = CONCAT44(fVar87,fVar86);
        local_2a0 = (float)local_24e0;
        fStack_29c = local_24e0._4_4_;
        fStack_298 = (float)uStack_24d8;
        fStack_294 = uStack_24d8._4_4_;
        fStack_290 = (float)uStack_24d0;
        fStack_28c = uStack_24d0._4_4_;
        fStack_288 = (float)uStack_24c8;
        fStack_1244 = uStack_24c8._4_4_;
        local_2c0._0_4_ = (float)local_35e0;
        local_2c0._4_4_ = (float)((ulong)local_35e0 >> 0x20);
        uStack_2b8._0_4_ = (float)uStack_35d8;
        uStack_2b8._4_4_ = (float)((ulong)uStack_35d8 >> 0x20);
        uStack_2b0._0_4_ = (float)uStack_35d0;
        uStack_2b0._4_4_ = (float)((ulong)uStack_35d0 >> 0x20);
        uStack_2a8._0_4_ = (float)uStack_35c8;
        local_1260 = (float)local_24e0 * (float)local_2c0;
        fStack_125c = local_24e0._4_4_ * local_2c0._4_4_;
        fStack_1258 = (float)uStack_24d8 * (float)uStack_2b8;
        fStack_1254 = uStack_24d8._4_4_ * uStack_2b8._4_4_;
        fStack_1250 = (float)uStack_24d0 * (float)uStack_2b0;
        fStack_124c = uStack_24d0._4_4_ * uStack_2b0._4_4_;
        fStack_1248 = (float)uStack_24c8 * (float)uStack_2a8;
        local_2180 = CONCAT44(fStack_125c + fVar81,local_1260 + fVar79);
        uStack_2178 = CONCAT44(fStack_1254 + fVar83,fStack_1258 + fVar82);
        uStack_2170 = CONCAT44(fStack_124c + fVar85,fStack_1250 + fVar84);
        uStack_2168 = CONCAT44(uStack_24c8._4_4_ + fVar87,fStack_1248 + fVar86);
        local_2148 = local_3c40 + 8;
        *(undefined8 *)local_2148 = local_2180;
        *(undefined8 *)(local_3c40 + 10) = uStack_2178;
        *(undefined8 *)(local_3c40 + 0xc) = uStack_2170;
        *(undefined8 *)(local_3c40 + 0xe) = uStack_2168;
        local_3c90 = local_3c90 + 0x20;
        local_3c98 = local_3c98 + 0x20;
        local_3ca0 = local_3ca0 + 0x20;
        local_3c40 = local_3c40 + 0x10;
        local_35c0 = uVar35;
        uStack_35b8 = uVar36;
        uStack_35b0 = uVar37;
        uStack_35a8 = uVar38;
        local_3560 = uVar31;
        uStack_3558 = uVar32;
        uStack_3550 = uVar33;
        uStack_3548 = uVar34;
        local_3500 = uVar27;
        uStack_34f8 = uVar28;
        uStack_34f0 = uVar29;
        uStack_34e8 = uVar30;
        local_34a0 = uVar23;
        uStack_3498 = uVar24;
        uStack_3490 = uVar25;
        uStack_3488 = uVar26;
        local_3440 = uVar19;
        uStack_3438 = uVar20;
        uStack_3430 = uVar21;
        uStack_3428 = uVar22;
        local_33e0 = uVar15;
        uStack_33d8 = uVar16;
        uStack_33d0 = uVar17;
        uStack_33c8 = uVar18;
        local_3380 = uVar11;
        uStack_3378 = uVar12;
        uStack_3370 = uVar13;
        uStack_3368 = uVar14;
        local_3320 = uVar7;
        uStack_3318 = uVar8;
        uStack_3310 = uVar9;
        uStack_3308 = uVar10;
        local_32c0 = uVar3;
        uStack_32b8 = uVar4;
        uStack_32b0 = uVar5;
        uStack_32a8 = uVar6;
        local_3280 = local_3520;
        uStack_3278 = uStack_3518;
        uStack_3270 = uStack_3510;
        uStack_3268 = uStack_3508;
        local_3260 = uVar35;
        uStack_3258 = uVar36;
        uStack_3250 = uVar37;
        uStack_3248 = uVar38;
        local_3200 = uVar31;
        uStack_31f8 = uVar32;
        uStack_31f0 = uVar33;
        uStack_31e8 = uVar34;
        local_31a0 = uVar27;
        uStack_3198 = uVar28;
        uStack_3190 = uVar29;
        uStack_3188 = uVar30;
        local_3160 = local_3400;
        uStack_3158 = uStack_33f8;
        uStack_3150 = uStack_33f0;
        uStack_3148 = uStack_33e8;
        local_3140 = uVar23;
        uStack_3138 = uVar24;
        uStack_3130 = uVar25;
        uStack_3128 = uVar26;
        local_30e0 = uVar19;
        uStack_30d8 = uVar20;
        uStack_30d0 = uVar21;
        uStack_30c8 = uVar22;
        local_3080 = uVar15;
        uStack_3078 = uVar16;
        uStack_3070 = uVar17;
        uStack_3068 = uVar18;
        local_3040 = local_32e0;
        uStack_3038 = uStack_32d8;
        uStack_3030 = uStack_32d0;
        uStack_3028 = uStack_32c8;
        local_3020 = uVar11;
        uStack_3018 = uVar12;
        uStack_3010 = uVar13;
        uStack_3008 = uVar14;
        local_2fc0 = uVar7;
        uStack_2fb8 = uVar8;
        uStack_2fb0 = uVar9;
        uStack_2fa8 = uVar10;
        local_2f60 = uVar3;
        uStack_2f58 = uVar4;
        uStack_2f50 = uVar5;
        uStack_2f48 = uVar6;
        local_1680 = local_3000;
        uStack_1678 = uStack_2ff8;
        uStack_1670 = uStack_2ff0;
        uStack_1668 = uStack_2fe8;
        local_1640 = local_3060;
        uStack_1638 = uStack_3058;
        uStack_1630 = uStack_3050;
        uStack_1628 = uStack_3048;
        local_1600 = local_30c0;
        uStack_15f8 = uStack_30b8;
        uStack_15f0 = uStack_30b0;
        uStack_15e8 = uStack_30a8;
        local_15c0 = local_3120;
        uStack_15b8 = uStack_3118;
        uStack_15b0 = uStack_3110;
        uStack_15a8 = uStack_3108;
        local_1580 = local_3180;
        uStack_1578 = uStack_3178;
        uStack_1570 = uStack_3170;
        uStack_1568 = uStack_3168;
        local_1540 = local_31e0;
        uStack_1538 = uStack_31d8;
        uStack_1530 = uStack_31d0;
        uStack_1528 = uStack_31c8;
        local_1500 = local_3240;
        uStack_14f8 = uStack_3238;
        uStack_14f0 = uStack_3230;
        uStack_14e8 = uStack_3228;
        local_14c0 = local_32a0;
        uStack_14b8 = uStack_3298;
        uStack_14b0 = uStack_3290;
        uStack_14a8 = uStack_3288;
        local_1440 = local_3360;
        uStack_1438 = uStack_3358;
        uStack_1430 = uStack_3350;
        uStack_1428 = uStack_3348;
        local_1400 = local_33c0;
        uStack_13f8 = uStack_33b8;
        uStack_13f0 = uStack_33b0;
        uStack_13e8 = uStack_33a8;
        local_13c0 = local_3420;
        uStack_13b8 = uStack_3418;
        uStack_13b0 = uStack_3410;
        uStack_13a8 = uStack_3408;
        local_1380 = local_3480;
        uStack_1378 = uStack_3478;
        uStack_1370 = uStack_3470;
        uStack_1368 = uStack_3468;
        local_1340 = local_34e0;
        uStack_1338 = uStack_34d8;
        uStack_1330 = uStack_34d0;
        uStack_1328 = uStack_34c8;
        local_1300 = local_3540;
        uStack_12f8 = uStack_3538;
        uStack_12f0 = uStack_3530;
        uStack_12e8 = uStack_3528;
        local_12c0 = local_35a0;
        uStack_12b8 = uStack_3598;
        uStack_12b0 = uStack_3590;
        uStack_12a8 = uStack_3588;
        local_1280 = local_3600;
        uStack_1278 = uStack_35f8;
        uStack_1270 = uStack_35f0;
        uStack_1268 = uStack_35e8;
        local_700 = local_2f80;
        uStack_6f8 = uStack_2f78;
        uStack_6f0 = uStack_2f70;
        uStack_6e8 = uStack_2f68;
        fStack_6c4 = fStack_1684;
        local_6c0 = local_2fe0;
        uStack_6b8 = uStack_2fd8;
        uStack_6b0 = uStack_2fd0;
        uStack_6a8 = uStack_2fc8;
        fStack_684 = fStack_1644;
        local_680 = local_32e0;
        uStack_678 = uStack_32d8;
        uStack_670 = uStack_32d0;
        uStack_668 = uStack_32c8;
        fStack_644 = fStack_1604;
        local_640 = local_30a0;
        uStack_638 = uStack_3098;
        uStack_630 = uStack_3090;
        uStack_628 = uStack_3088;
        fStack_604 = fStack_15c4;
        local_600 = local_3100;
        uStack_5f8 = uStack_30f8;
        uStack_5f0 = uStack_30f0;
        uStack_5e8 = uStack_30e8;
        fStack_5c4 = fStack_1584;
        local_5c0 = local_3400;
        uStack_5b8 = uStack_33f8;
        uStack_5b0 = uStack_33f0;
        uStack_5a8 = uStack_33e8;
        fStack_584 = fStack_1544;
        local_580 = local_31c0;
        uStack_578 = uStack_31b8;
        uStack_570 = uStack_31b0;
        uStack_568 = uStack_31a8;
        fStack_544 = fStack_1504;
        local_540 = local_3220;
        uStack_538 = uStack_3218;
        uStack_530 = uStack_3210;
        uStack_528 = uStack_3208;
        fStack_504 = fStack_14c4;
        local_500 = local_3520;
        uStack_4f8 = uStack_3518;
        uStack_4f0 = uStack_3510;
        uStack_4e8 = uStack_3508;
        fStack_4c4 = fStack_1484;
        local_4c0 = local_32e0;
        uStack_4b8 = uStack_32d8;
        uStack_4b0 = uStack_32d0;
        uStack_4a8 = uStack_32c8;
        fStack_484 = fStack_1444;
        local_480 = local_3340;
        uStack_478 = uStack_3338;
        uStack_470 = uStack_3330;
        uStack_468 = uStack_3328;
        fStack_444 = fStack_1404;
        local_440 = local_33a0;
        uStack_438 = uStack_3398;
        uStack_430 = uStack_3390;
        uStack_428 = uStack_3388;
        fStack_404 = fStack_13c4;
        local_400 = local_3400;
        uStack_3f8 = uStack_33f8;
        uStack_3f0 = uStack_33f0;
        uStack_3e8 = uStack_33e8;
        fStack_3c4 = fStack_1384;
        local_3c0 = local_3460;
        uStack_3b8 = uStack_3458;
        uStack_3b0 = uStack_3450;
        uStack_3a8 = uStack_3448;
        fStack_384 = fStack_1344;
        local_380 = local_34c0;
        uStack_378 = uStack_34b8;
        uStack_370 = uStack_34b0;
        uStack_368 = uStack_34a8;
        fStack_344 = fStack_1304;
        local_340 = local_3520;
        uStack_338 = uStack_3518;
        uStack_330 = uStack_3510;
        uStack_328 = uStack_3508;
        fStack_304 = fStack_12c4;
        local_300 = local_3580;
        uStack_2f8 = uStack_3578;
        uStack_2f0 = uStack_3570;
        uStack_2e8 = uStack_3568;
        fStack_2c4 = fStack_1284;
        local_2c0 = local_35e0;
        uStack_2b8 = uStack_35d8;
        uStack_2b0 = uStack_35d0;
        uStack_2a8 = uStack_35c8;
        fStack_284 = fStack_1244;
      }
      for (; local_3dc8 < local_3b80; local_3dc8 = local_3dc8 + 1) {
        local_3b08 = local_3c90;
        local_3640 = *(undefined8 *)local_3c90;
        uStack_3638 = *(undefined8 *)(local_3c90 + 2);
        uStack_3630 = *(undefined8 *)(local_3c90 + 4);
        uStack_3628 = *(undefined8 *)(local_3c90 + 6);
        local_3b10 = local_3c90 + 8;
        local_36a0 = *(undefined8 *)local_3b10;
        uStack_3698 = *(undefined8 *)(local_3c90 + 10);
        uStack_3690 = *(undefined8 *)(local_3c90 + 0xc);
        uStack_3688 = *(undefined8 *)(local_3c90 + 0xe);
        local_3b18 = local_3c90 + 0x10;
        local_3700 = *(undefined8 *)local_3b18;
        uStack_36f8 = *(undefined8 *)(local_3c90 + 0x12);
        uStack_36f0 = *(undefined8 *)(local_3c90 + 0x14);
        uStack_36e8 = *(undefined8 *)(local_3c90 + 0x16);
        local_3b20 = local_3c98;
        local_3760 = *(undefined8 *)local_3c98;
        uStack_3758 = *(undefined8 *)(local_3c98 + 2);
        uStack_3750 = *(undefined8 *)(local_3c98 + 4);
        uStack_3748 = *(undefined8 *)(local_3c98 + 6);
        local_3b28 = local_3c98 + 8;
        local_37c0 = *(undefined8 *)local_3b28;
        uStack_37b8 = *(undefined8 *)(local_3c98 + 10);
        uStack_37b0 = *(undefined8 *)(local_3c98 + 0xc);
        uStack_37a8 = *(undefined8 *)(local_3c98 + 0xe);
        local_3b30 = local_3c98 + 0x10;
        local_3820 = *(undefined8 *)local_3b30;
        uStack_3818 = *(undefined8 *)(local_3c98 + 0x12);
        uStack_3810 = *(undefined8 *)(local_3c98 + 0x14);
        uStack_3808 = *(undefined8 *)(local_3c98 + 0x16);
        local_3b38 = local_3ca0;
        local_3880 = *(undefined8 *)local_3ca0;
        uStack_3878 = *(undefined8 *)(local_3ca0 + 2);
        uStack_3870 = *(undefined8 *)(local_3ca0 + 4);
        uStack_3868 = *(undefined8 *)(local_3ca0 + 6);
        local_3b40 = local_3ca0 + 8;
        local_38e0 = *(undefined8 *)local_3b40;
        uStack_38d8 = *(undefined8 *)(local_3ca0 + 10);
        uStack_38d0 = *(undefined8 *)(local_3ca0 + 0xc);
        uStack_38c8 = *(undefined8 *)(local_3ca0 + 0xe);
        local_3b48 = local_3ca0 + 0x10;
        local_3940 = *(undefined8 *)local_3b48;
        uStack_3938 = *(undefined8 *)(local_3ca0 + 0x12);
        uStack_3930 = *(undefined8 *)(local_3ca0 + 0x14);
        uStack_3928 = *(undefined8 *)(local_3ca0 + 0x16);
        local_3660 = local_3c20;
        uStack_3658 = uStack_3c18;
        uStack_3650 = uStack_3c10;
        uStack_3648 = uStack_3c08;
        local_260 = (float)local_21e0;
        fStack_25c = local_21e0._4_4_;
        fStack_258 = (float)uStack_21d8;
        fStack_254 = uStack_21d8._4_4_;
        fStack_250 = (float)uStack_21d0;
        fStack_24c = uStack_21d0._4_4_;
        fStack_248 = (float)uStack_21c8;
        fStack_1204 = uStack_21c8._4_4_;
        local_280._0_4_ = (float)local_3640;
        local_280._4_4_ = (float)((ulong)local_3640 >> 0x20);
        uStack_278._0_4_ = (float)uStack_3638;
        uStack_278._4_4_ = (float)((ulong)uStack_3638 >> 0x20);
        uStack_270._0_4_ = (float)uStack_3630;
        uStack_270._4_4_ = (float)((ulong)uStack_3630 >> 0x20);
        uStack_268._0_4_ = (float)uStack_3628;
        local_1220 = (float)local_21e0 * (float)local_280;
        fStack_121c = local_21e0._4_4_ * local_280._4_4_;
        fStack_1218 = (float)uStack_21d8 * (float)uStack_278;
        fStack_1214 = uStack_21d8._4_4_ * uStack_278._4_4_;
        fStack_1210 = (float)uStack_21d0 * (float)uStack_270;
        fStack_120c = uStack_21d0._4_4_ * uStack_270._4_4_;
        fStack_1208 = (float)uStack_21c8 * (float)uStack_268;
        local_1240 = local_3c20;
        uStack_1238 = uStack_3c18;
        uStack_1230 = uStack_3c10;
        uStack_1228 = uStack_3c08;
        local_36c0 = CONCAT44(fStack_121c + local_1fc0._4_4_,local_1220 + (float)local_1fc0);
        uStack_36b8 = CONCAT44(fStack_1214 + uStack_1fb8._4_4_,fStack_1218 + (float)uStack_1fb8);
        uStack_36b0 = CONCAT44(fStack_120c + uStack_1fb0._4_4_,fStack_1210 + (float)uStack_1fb0);
        uStack_36a8 = CONCAT44(uStack_21c8._4_4_ + uStack_1fa8._4_4_,
                               fStack_1208 + (float)uStack_1fa8);
        local_220 = (float)local_2240;
        fStack_21c = local_2240._4_4_;
        fStack_218 = (float)uStack_2238;
        fStack_214 = uStack_2238._4_4_;
        fStack_210 = (float)uStack_2230;
        fStack_20c = uStack_2230._4_4_;
        fStack_208 = (float)uStack_2228;
        fStack_11c4 = uStack_2228._4_4_;
        local_240._0_4_ = (float)local_36a0;
        local_240._4_4_ = (float)((ulong)local_36a0 >> 0x20);
        uStack_238._0_4_ = (float)uStack_3698;
        uStack_238._4_4_ = (float)((ulong)uStack_3698 >> 0x20);
        uStack_230._0_4_ = (float)uStack_3690;
        uStack_230._4_4_ = (float)((ulong)uStack_3690 >> 0x20);
        uStack_228._0_4_ = (float)uStack_3688;
        local_11e0 = (float)local_2240 * (float)local_240;
        fStack_11dc = local_2240._4_4_ * local_240._4_4_;
        fStack_11d8 = (float)uStack_2238 * (float)uStack_238;
        fStack_11d4 = uStack_2238._4_4_ * uStack_238._4_4_;
        fStack_11d0 = (float)uStack_2230 * (float)uStack_230;
        fStack_11cc = uStack_2230._4_4_ * uStack_230._4_4_;
        fStack_11c8 = (float)uStack_2228 * (float)uStack_228;
        fVar79 = local_11e0 + local_1220 + (float)local_1fc0;
        fVar81 = fStack_11dc + fStack_121c + local_1fc0._4_4_;
        fVar82 = fStack_11d8 + fStack_1218 + (float)uStack_1fb8;
        in_stack_ffffffffffffab0c = fStack_11d4 + fStack_1214 + uStack_1fb8._4_4_;
        in_stack_ffffffffffffab10 = fStack_11d0 + fStack_1210 + (float)uStack_1fb0;
        in_stack_ffffffffffffab14 = fStack_11cc + fStack_120c + uStack_1fb0._4_4_;
        fVar83 = fStack_11c8 + fStack_1208 + (float)uStack_1fa8;
        fVar84 = uStack_2228._4_4_ + uStack_21c8._4_4_ + uStack_1fa8._4_4_;
        local_3720 = CONCAT44(fVar81,fVar79);
        uStack_3718 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_3710 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_3708 = CONCAT44(fVar84,fVar83);
        local_1e0 = (float)local_22a0;
        fStack_1dc = local_22a0._4_4_;
        fStack_1d8 = (float)uStack_2298;
        fStack_1d4 = uStack_2298._4_4_;
        fStack_1d0 = (float)uStack_2290;
        fStack_1cc = uStack_2290._4_4_;
        fStack_1c8 = (float)uStack_2288;
        fStack_1184 = uStack_2288._4_4_;
        local_200._0_4_ = (float)local_3700;
        local_200._4_4_ = (float)((ulong)local_3700 >> 0x20);
        uStack_1f8._0_4_ = (float)uStack_36f8;
        uStack_1f8._4_4_ = (float)((ulong)uStack_36f8 >> 0x20);
        uStack_1f0._0_4_ = (float)uStack_36f0;
        uStack_1f0._4_4_ = (float)((ulong)uStack_36f0 >> 0x20);
        uStack_1e8._0_4_ = (float)uStack_36e8;
        local_11a0 = (float)local_22a0 * (float)local_200;
        fStack_119c = local_22a0._4_4_ * local_200._4_4_;
        fStack_1198 = (float)uStack_2298 * (float)uStack_1f8;
        fStack_1194 = uStack_2298._4_4_ * uStack_1f8._4_4_;
        fStack_1190 = (float)uStack_2290 * (float)uStack_1f0;
        fStack_118c = uStack_2290._4_4_ * uStack_1f0._4_4_;
        fStack_1188 = (float)uStack_2288 * (float)uStack_1e8;
        fVar79 = local_11a0 + fVar79;
        fVar81 = fStack_119c + fVar81;
        fVar82 = fStack_1198 + fVar82;
        in_stack_ffffffffffffab0c = fStack_1194 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_1190 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_118c + in_stack_ffffffffffffab14;
        fVar83 = fStack_1188 + fVar83;
        fVar84 = uStack_2288._4_4_ + fVar84;
        local_3780 = CONCAT44(fVar81,fVar79);
        uStack_3778 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_3770 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_3768 = CONCAT44(fVar84,fVar83);
        local_1a0 = (float)local_2300;
        fStack_19c = local_2300._4_4_;
        fStack_198 = (float)uStack_22f8;
        fStack_194 = uStack_22f8._4_4_;
        fStack_190 = (float)uStack_22f0;
        fStack_18c = uStack_22f0._4_4_;
        fStack_188 = (float)uStack_22e8;
        fStack_1144 = uStack_22e8._4_4_;
        local_1c0._0_4_ = (float)local_3760;
        local_1c0._4_4_ = (float)((ulong)local_3760 >> 0x20);
        uStack_1b8._0_4_ = (float)uStack_3758;
        uStack_1b8._4_4_ = (float)((ulong)uStack_3758 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_3750;
        uStack_1b0._4_4_ = (float)((ulong)uStack_3750 >> 0x20);
        uStack_1a8._0_4_ = (float)uStack_3748;
        local_1160 = (float)local_2300 * (float)local_1c0;
        fStack_115c = local_2300._4_4_ * local_1c0._4_4_;
        fStack_1158 = (float)uStack_22f8 * (float)uStack_1b8;
        fStack_1154 = uStack_22f8._4_4_ * uStack_1b8._4_4_;
        fStack_1150 = (float)uStack_22f0 * (float)uStack_1b0;
        fStack_114c = uStack_22f0._4_4_ * uStack_1b0._4_4_;
        fStack_1148 = (float)uStack_22e8 * (float)uStack_1a8;
        fVar79 = local_1160 + fVar79;
        fVar81 = fStack_115c + fVar81;
        fVar82 = fStack_1158 + fVar82;
        in_stack_ffffffffffffab0c = fStack_1154 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_1150 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_114c + in_stack_ffffffffffffab14;
        fVar83 = fStack_1148 + fVar83;
        fVar84 = uStack_22e8._4_4_ + fVar84;
        local_37e0 = CONCAT44(fVar81,fVar79);
        uStack_37d8 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_37d0 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_37c8 = CONCAT44(fVar84,fVar83);
        local_160 = (float)local_2360;
        fStack_15c = local_2360._4_4_;
        fStack_158 = (float)uStack_2358;
        fStack_154 = uStack_2358._4_4_;
        fStack_150 = (float)uStack_2350;
        fStack_14c = uStack_2350._4_4_;
        fStack_148 = (float)uStack_2348;
        fStack_1104 = uStack_2348._4_4_;
        local_180._0_4_ = (float)local_37c0;
        local_180._4_4_ = (float)((ulong)local_37c0 >> 0x20);
        uStack_178._0_4_ = (float)uStack_37b8;
        uStack_178._4_4_ = (float)((ulong)uStack_37b8 >> 0x20);
        uStack_170._0_4_ = (float)uStack_37b0;
        uStack_170._4_4_ = (float)((ulong)uStack_37b0 >> 0x20);
        uStack_168._0_4_ = (float)uStack_37a8;
        local_1120 = (float)local_2360 * (float)local_180;
        fStack_111c = local_2360._4_4_ * local_180._4_4_;
        fStack_1118 = (float)uStack_2358 * (float)uStack_178;
        fStack_1114 = uStack_2358._4_4_ * uStack_178._4_4_;
        fStack_1110 = (float)uStack_2350 * (float)uStack_170;
        fStack_110c = uStack_2350._4_4_ * uStack_170._4_4_;
        fStack_1108 = (float)uStack_2348 * (float)uStack_168;
        fVar79 = local_1120 + fVar79;
        fVar81 = fStack_111c + fVar81;
        fVar82 = fStack_1118 + fVar82;
        in_stack_ffffffffffffab0c = fStack_1114 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_1110 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_110c + in_stack_ffffffffffffab14;
        fVar83 = fStack_1108 + fVar83;
        fVar84 = uStack_2348._4_4_ + fVar84;
        local_3840 = CONCAT44(fVar81,fVar79);
        uStack_3838 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_3830 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_3828 = CONCAT44(fVar84,fVar83);
        local_120 = (float)local_23c0;
        fStack_11c = local_23c0._4_4_;
        fStack_118 = (float)uStack_23b8;
        fStack_114 = uStack_23b8._4_4_;
        fStack_110 = (float)uStack_23b0;
        fStack_10c = uStack_23b0._4_4_;
        fStack_108 = (float)uStack_23a8;
        fStack_10c4 = uStack_23a8._4_4_;
        local_140._0_4_ = (float)local_3820;
        local_140._4_4_ = (float)((ulong)local_3820 >> 0x20);
        uStack_138._0_4_ = (float)uStack_3818;
        uStack_138._4_4_ = (float)((ulong)uStack_3818 >> 0x20);
        uStack_130._0_4_ = (float)uStack_3810;
        uStack_130._4_4_ = (float)((ulong)uStack_3810 >> 0x20);
        uStack_128._0_4_ = (float)uStack_3808;
        local_10e0 = (float)local_23c0 * (float)local_140;
        fStack_10dc = local_23c0._4_4_ * local_140._4_4_;
        fStack_10d8 = (float)uStack_23b8 * (float)uStack_138;
        fStack_10d4 = uStack_23b8._4_4_ * uStack_138._4_4_;
        fStack_10d0 = (float)uStack_23b0 * (float)uStack_130;
        fStack_10cc = uStack_23b0._4_4_ * uStack_130._4_4_;
        fStack_10c8 = (float)uStack_23a8 * (float)uStack_128;
        fVar79 = local_10e0 + fVar79;
        fVar81 = fStack_10dc + fVar81;
        fVar82 = fStack_10d8 + fVar82;
        in_stack_ffffffffffffab0c = fStack_10d4 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_10d0 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_10cc + in_stack_ffffffffffffab14;
        fVar83 = fStack_10c8 + fVar83;
        fVar84 = uStack_23a8._4_4_ + fVar84;
        local_38a0 = CONCAT44(fVar81,fVar79);
        uStack_3898 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_3890 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_3888 = CONCAT44(fVar84,fVar83);
        local_e0 = (float)local_2420;
        fStack_dc = local_2420._4_4_;
        fStack_d8 = (float)uStack_2418;
        fStack_d4 = uStack_2418._4_4_;
        fStack_d0 = (float)uStack_2410;
        fStack_cc = uStack_2410._4_4_;
        fStack_c8 = (float)uStack_2408;
        fStack_1084 = uStack_2408._4_4_;
        local_100._0_4_ = (float)local_3880;
        local_100._4_4_ = (float)((ulong)local_3880 >> 0x20);
        uStack_f8._0_4_ = (float)uStack_3878;
        uStack_f8._4_4_ = (float)((ulong)uStack_3878 >> 0x20);
        uStack_f0._0_4_ = (float)uStack_3870;
        uStack_f0._4_4_ = (float)((ulong)uStack_3870 >> 0x20);
        uStack_e8._0_4_ = (float)uStack_3868;
        local_10a0 = (float)local_2420 * (float)local_100;
        fStack_109c = local_2420._4_4_ * local_100._4_4_;
        fStack_1098 = (float)uStack_2418 * (float)uStack_f8;
        fStack_1094 = uStack_2418._4_4_ * uStack_f8._4_4_;
        fStack_1090 = (float)uStack_2410 * (float)uStack_f0;
        fStack_108c = uStack_2410._4_4_ * uStack_f0._4_4_;
        fStack_1088 = (float)uStack_2408 * (float)uStack_e8;
        fVar79 = local_10a0 + fVar79;
        fVar81 = fStack_109c + fVar81;
        fVar82 = fStack_1098 + fVar82;
        in_stack_ffffffffffffab0c = fStack_1094 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_1090 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_108c + in_stack_ffffffffffffab14;
        fVar83 = fStack_1088 + fVar83;
        fVar84 = uStack_2408._4_4_ + fVar84;
        local_3900 = CONCAT44(fVar81,fVar79);
        uStack_38f8 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_38f0 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_38e8 = CONCAT44(fVar84,fVar83);
        local_a0 = (float)local_2480;
        fStack_9c = local_2480._4_4_;
        fStack_98 = (float)uStack_2478;
        fStack_94 = uStack_2478._4_4_;
        fStack_90 = (float)uStack_2470;
        fStack_8c = uStack_2470._4_4_;
        fStack_88 = (float)uStack_2468;
        fStack_1044 = uStack_2468._4_4_;
        local_c0._0_4_ = (float)local_38e0;
        local_c0._4_4_ = (float)((ulong)local_38e0 >> 0x20);
        uStack_b8._0_4_ = (float)uStack_38d8;
        uStack_b8._4_4_ = (float)((ulong)uStack_38d8 >> 0x20);
        uStack_b0._0_4_ = (float)uStack_38d0;
        uStack_b0._4_4_ = (float)((ulong)uStack_38d0 >> 0x20);
        uStack_a8._0_4_ = (float)uStack_38c8;
        local_1060 = (float)local_2480 * (float)local_c0;
        fStack_105c = local_2480._4_4_ * local_c0._4_4_;
        fStack_1058 = (float)uStack_2478 * (float)uStack_b8;
        fStack_1054 = uStack_2478._4_4_ * uStack_b8._4_4_;
        fStack_1050 = (float)uStack_2470 * (float)uStack_b0;
        fStack_104c = uStack_2470._4_4_ * uStack_b0._4_4_;
        fStack_1048 = (float)uStack_2468 * (float)uStack_a8;
        fVar79 = local_1060 + fVar79;
        fVar81 = fStack_105c + fVar81;
        fVar82 = fStack_1058 + fVar82;
        in_stack_ffffffffffffab0c = fStack_1054 + in_stack_ffffffffffffab0c;
        in_stack_ffffffffffffab10 = fStack_1050 + in_stack_ffffffffffffab10;
        in_stack_ffffffffffffab14 = fStack_104c + in_stack_ffffffffffffab14;
        fVar83 = fStack_1048 + fVar83;
        fVar84 = uStack_2468._4_4_ + fVar84;
        local_3960 = CONCAT44(fVar81,fVar79);
        uStack_3958 = CONCAT44(in_stack_ffffffffffffab0c,fVar82);
        uStack_3950 = CONCAT44(in_stack_ffffffffffffab14,in_stack_ffffffffffffab10);
        uStack_3948 = CONCAT44(fVar84,fVar83);
        local_60 = (float)local_24e0;
        fStack_5c = local_24e0._4_4_;
        fStack_58 = (float)uStack_24d8;
        fStack_54 = uStack_24d8._4_4_;
        fStack_50 = (float)uStack_24d0;
        fStack_4c = uStack_24d0._4_4_;
        fStack_48 = (float)uStack_24c8;
        fStack_1004 = uStack_24c8._4_4_;
        local_80._0_4_ = (float)local_3940;
        local_80._4_4_ = (float)((ulong)local_3940 >> 0x20);
        uStack_78._0_4_ = (float)uStack_3938;
        uStack_78._4_4_ = (float)((ulong)uStack_3938 >> 0x20);
        uStack_70._0_4_ = (float)uStack_3930;
        uStack_70._4_4_ = (float)((ulong)uStack_3930 >> 0x20);
        uStack_68._0_4_ = (float)uStack_3928;
        local_1020 = (float)local_24e0 * (float)local_80;
        fStack_101c = local_24e0._4_4_ * local_80._4_4_;
        fStack_1018 = (float)uStack_24d8 * (float)uStack_78;
        fStack_1014 = uStack_24d8._4_4_ * uStack_78._4_4_;
        fStack_1010 = (float)uStack_24d0 * (float)uStack_70;
        fStack_100c = uStack_24d0._4_4_ * uStack_70._4_4_;
        fStack_1008 = (float)uStack_24c8 * (float)uStack_68;
        local_21c0 = CONCAT44(fStack_101c + fVar81,local_1020 + fVar79);
        uStack_21b8 = CONCAT44(fStack_1014 + in_stack_ffffffffffffab0c,fStack_1018 + fVar82);
        uStack_21b0 = CONCAT44(fStack_100c + in_stack_ffffffffffffab14,
                               fStack_1010 + in_stack_ffffffffffffab10);
        uStack_21a8 = CONCAT44(uStack_24c8._4_4_ + fVar84,fStack_1008 + fVar83);
        local_2188 = local_3c40;
        *(undefined8 *)local_3c40 = local_21c0;
        *(undefined8 *)(local_3c40 + 2) = uStack_21b8;
        *(undefined8 *)(local_3c40 + 4) = uStack_21b0;
        *(undefined8 *)(local_3c40 + 6) = uStack_21a8;
        local_3c90 = local_3c90 + 0x10;
        local_3c98 = local_3c98 + 0x10;
        local_3ca0 = local_3ca0 + 0x10;
        local_3c40 = local_3c40 + 8;
        local_3920 = uVar35;
        uStack_3918 = uVar36;
        uStack_3910 = uVar37;
        uStack_3908 = uVar38;
        local_38c0 = uVar31;
        uStack_38b8 = uVar32;
        uStack_38b0 = uVar33;
        uStack_38a8 = uVar34;
        local_3860 = uVar27;
        uStack_3858 = uVar28;
        uStack_3850 = uVar29;
        uStack_3848 = uVar30;
        local_3800 = uVar23;
        uStack_37f8 = uVar24;
        uStack_37f0 = uVar25;
        uStack_37e8 = uVar26;
        local_37a0 = uVar19;
        uStack_3798 = uVar20;
        uStack_3790 = uVar21;
        uStack_3788 = uVar22;
        local_3740 = uVar15;
        uStack_3738 = uVar16;
        uStack_3730 = uVar17;
        uStack_3728 = uVar18;
        local_36e0 = uVar11;
        uStack_36d8 = uVar12;
        uStack_36d0 = uVar13;
        uStack_36c8 = uVar14;
        local_3680 = uVar7;
        uStack_3678 = uVar8;
        uStack_3670 = uVar9;
        uStack_3668 = uVar10;
        local_3620 = uVar3;
        uStack_3618 = uVar4;
        uStack_3610 = uVar5;
        uStack_3608 = uVar6;
        local_1200 = local_36c0;
        uStack_11f8 = uStack_36b8;
        uStack_11f0 = uStack_36b0;
        uStack_11e8 = uStack_36a8;
        local_11c0 = local_3720;
        uStack_11b8 = uStack_3718;
        uStack_11b0 = uStack_3710;
        uStack_11a8 = uStack_3708;
        local_1180 = local_3780;
        uStack_1178 = uStack_3778;
        uStack_1170 = uStack_3770;
        uStack_1168 = uStack_3768;
        local_1140 = local_37e0;
        uStack_1138 = uStack_37d8;
        uStack_1130 = uStack_37d0;
        uStack_1128 = uStack_37c8;
        local_1100 = local_3840;
        uStack_10f8 = uStack_3838;
        uStack_10f0 = uStack_3830;
        uStack_10e8 = uStack_3828;
        local_10c0 = local_38a0;
        uStack_10b8 = uStack_3898;
        uStack_10b0 = uStack_3890;
        uStack_10a8 = uStack_3888;
        local_1080 = local_3900;
        uStack_1078 = uStack_38f8;
        uStack_1070 = uStack_38f0;
        uStack_1068 = uStack_38e8;
        local_1040 = local_3960;
        uStack_1038 = uStack_3958;
        uStack_1030 = uStack_3950;
        uStack_1028 = uStack_3948;
        local_280 = local_3640;
        uStack_278 = uStack_3638;
        uStack_270 = uStack_3630;
        uStack_268 = uStack_3628;
        fStack_244 = fStack_1204;
        local_240 = local_36a0;
        uStack_238 = uStack_3698;
        uStack_230 = uStack_3690;
        uStack_228 = uStack_3688;
        fStack_204 = fStack_11c4;
        local_200 = local_3700;
        uStack_1f8 = uStack_36f8;
        uStack_1f0 = uStack_36f0;
        uStack_1e8 = uStack_36e8;
        fStack_1c4 = fStack_1184;
        local_1c0 = local_3760;
        uStack_1b8 = uStack_3758;
        uStack_1b0 = uStack_3750;
        uStack_1a8 = uStack_3748;
        fStack_184 = fStack_1144;
        local_180 = local_37c0;
        uStack_178 = uStack_37b8;
        uStack_170 = uStack_37b0;
        uStack_168 = uStack_37a8;
        fStack_144 = fStack_1104;
        local_140 = local_3820;
        uStack_138 = uStack_3818;
        uStack_130 = uStack_3810;
        uStack_128 = uStack_3808;
        fStack_104 = fStack_10c4;
        local_100 = local_3880;
        uStack_f8 = uStack_3878;
        uStack_f0 = uStack_3870;
        uStack_e8 = uStack_3868;
        fStack_c4 = fStack_1084;
        local_c0 = local_38e0;
        uStack_b8 = uStack_38d8;
        uStack_b0 = uStack_38d0;
        uStack_a8 = uStack_38c8;
        fStack_84 = fStack_1044;
        local_80 = local_3940;
        uStack_78 = uStack_3938;
        uStack_70 = uStack_3930;
        uStack_68 = uStack_3928;
        fStack_44 = fStack_1004;
      }
      local_3c90 = local_3c90 + local_3b8c;
      local_3c98 = local_3c98 + local_3b8c;
      local_3ca0 = local_3ca0 + local_3b8c;
      local_24e0 = uVar39;
      uStack_24d8 = uVar40;
      uStack_24d0 = uVar41;
      uStack_24c8 = uVar42;
      local_2480 = uVar43;
      uStack_2478 = uVar44;
      uStack_2470 = uVar45;
      uStack_2468 = uVar46;
      local_2420 = uVar47;
      uStack_2418 = uVar48;
      uStack_2410 = uVar49;
      uStack_2408 = uVar50;
      local_23c0 = uVar51;
      uStack_23b8 = uVar52;
      uStack_23b0 = uVar53;
      uStack_23a8 = uVar54;
      local_2360 = uVar55;
      uStack_2358 = uVar56;
      uStack_2350 = uVar57;
      uStack_2348 = uVar58;
      local_2300 = uVar59;
      uStack_22f8 = uVar60;
      uStack_22f0 = uVar61;
      uStack_22e8 = uVar62;
      local_22a0 = uVar63;
      uStack_2298 = uVar64;
      uStack_2290 = uVar65;
      uStack_2288 = uVar66;
      local_2240 = uVar67;
      uStack_2238 = uVar68;
      uStack_2230 = uVar69;
      uStack_2228 = uVar70;
      local_21e0 = uVar71;
      uStack_21d8 = uVar72;
      uStack_21d0 = uVar73;
      uStack_21c8 = uVar74;
      local_1fc0 = uVar75;
      uStack_1fb8 = uVar76;
      uStack_1fb0 = uVar77;
      uStack_1fa8 = uVar78;
    }
    Mat::~Mat((Mat *)0x664303);
    Mat::~Mat((Mat *)0x664310);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm256_storeu_ps(outptr0, _sum0);
                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}